

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

fdb_compact_decision
compaction_cb(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
             uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_encryption_key *pfVar1;
  short *psVar2;
  size_t *psVar3;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  fdb_kvs_handle *pfVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  uint64_t extraout_RAX;
  uint64_t uVar11;
  fdb_kvs_handle *pfVar12;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar13;
  __atomic_base<unsigned_long> doc_00;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_config *kvs_config;
  fdb_file_info *__n;
  fdb_kvs_commit_marker_t *pfVar15;
  fdb_file_info *kvs_config_00;
  void *__s2;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  code *__s;
  list *ptr_handle;
  fdb_kvs_handle **ppfVar19;
  char cVar20;
  uint uVar21;
  fdb_kvs_handle *pfVar22;
  char *pcVar23;
  fdb_file_info *info;
  fdb_file_handle *pfVar24;
  fdb_iterator *pfVar25;
  fdb_doc *pfVar26;
  fdb_kvs_handle *pfVar27;
  undefined1 handle [8];
  __atomic_base<unsigned_long> _Var28;
  filemgr *ptr_fhandle;
  fdb_config *pfVar29;
  ulong uVar30;
  btree *pbVar31;
  size_t sVar32;
  char *pcVar33;
  char *pcVar34;
  fdb_doc **ppfVar35;
  timeval tVar36;
  timeval tVar37;
  fdb_doc *rdoc;
  timeval __test_begin;
  fdb_kvs_handle *pfStack_18b90;
  undefined1 auStack_18b88 [16];
  undefined1 auStack_18b78 [8];
  undefined1 auStack_18b70 [80];
  ulong uStack_18b20;
  timeval tStack_18b00;
  fdb_file_info afStack_18af0 [3];
  fdb_file_info afStack_189f0 [3];
  fdb_config fStack_188f0;
  filemgr *pfStack_187f8;
  fdb_kvs_handle *pfStack_187f0;
  fdb_kvs_handle *pfStack_187e8;
  fdb_config *pfStack_187e0;
  fdb_kvs_handle *pfStack_187d8;
  fdb_kvs_handle *pfStack_187d0;
  fdb_file_handle *pfStack_187c0;
  fdb_kvs_handle *pfStack_187b8;
  timeval atStack_187b0 [2];
  timeval tStack_18790;
  timeval tStack_18780;
  undefined1 auStack_18770 [70];
  undefined1 uStack_1872a;
  undefined8 uStack_18720;
  filemgr *pfStack_18660;
  fdb_kvs_handle *pfStack_18658;
  fdb_kvs_handle *pfStack_18650;
  filemgr *pfStack_18648;
  fdb_kvs_handle *pfStack_18640;
  fdb_kvs_handle *pfStack_18638;
  undefined1 auStack_18628 [8];
  undefined1 auStack_18620 [8];
  undefined1 auStack_18618 [8];
  undefined1 auStack_18610 [16];
  undefined1 auStack_18600 [16];
  fdb_kvs_config fStack_185f0;
  atomic<unsigned_long> aStack_185d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_185d0;
  __atomic_base<unsigned_long> _Stack_185c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_185c0;
  undefined1 auStack_185b8 [8];
  undefined1 auStack_185b0 [16];
  undefined1 auStack_185a0 [16];
  atomic<unsigned_long> aStack_18590;
  fdb_open_flags fStack_1857c;
  ushort uStack_18572;
  filemgr *pfStack_18568;
  atomic<unsigned_long> aStack_18528;
  undefined1 auStack_184a8 [16];
  timeval tStack_18498;
  undefined1 auStack_18488 [328];
  char acStack_18340 [256];
  char acStack_18240 [256];
  fdb_kvs_handle afStack_18140 [153];
  fdb_kvs_handle *pfStack_4878;
  fdb_kvs_handle *pfStack_4870;
  list *plStack_4868;
  void *pvStack_4860;
  fdb_kvs_config fStack_4858;
  fdb_kvs_info fStack_4840;
  timeval tStack_4810;
  fdb_config fStack_4800;
  char acStack_4708 [256];
  fdb_kvs_handle afStack_4608 [2];
  fdb_kvs_handle **ppfStack_40e0;
  fdb_kvs_handle *pfStack_40d8;
  fdb_kvs_handle *pfStack_40d0;
  fdb_kvs_config *pfStack_40c8;
  fdb_kvs_handle *pfStack_40c0;
  fdb_kvs_handle *pfStack_40b8;
  undefined1 auStack_40a0 [16];
  undefined1 auStack_4090 [32];
  fdb_kvs_handle *pfStack_4070;
  fdb_kvs_config fStack_4068;
  fdb_kvs_info fStack_4050;
  timeval tStack_4020;
  char acStack_4010 [256];
  undefined1 auStack_3f10 [752];
  char acStack_3c20 [256];
  fdb_kvs_handle fStack_3b20;
  fdb_doc **ppfStack_3918;
  fdb_kvs_handle *pfStack_3910;
  undefined1 auStack_38f8 [16];
  fdb_doc *pfStack_38e8;
  fdb_kvs_handle *pfStack_38e0;
  fdb_doc *apfStack_38d8 [11];
  timeval tStack_3880;
  undefined1 auStack_3870 [536];
  char acStack_3658 [256];
  stat sStack_3558;
  fdb_config fStack_34c8;
  fdb_kvs_handle **ppfStack_33d0;
  fdb_kvs_handle *pfStack_33c8;
  fdb_kvs_handle *pfStack_33c0;
  fdb_kvs_handle *pfStack_33b8;
  btree *pbStack_33b0;
  fdb_kvs_handle *pfStack_33a8;
  fdb_kvs_handle *pfStack_3398;
  fdb_kvs_handle *pfStack_3390;
  fdb_file_handle *pfStack_3388;
  fdb_kvs_handle *pfStack_3380;
  undefined1 auStack_3378 [32];
  undefined1 auStack_3358 [40];
  fdb_file_info fStack_3330;
  fdb_config fStack_32e8;
  btree abStack_31f0 [4];
  char acStack_30f0 [256];
  char acStack_2ff0 [264];
  code *pcStack_2ee8;
  fdb_kvs_handle *pfStack_2ee0;
  fdb_kvs_handle *pfStack_2ed8;
  char *pcStack_2ed0;
  char *pcStack_2ec8;
  fdb_kvs_handle *pfStack_2ec0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2ea8;
  fdb_file_handle *pfStack_2ea0;
  fdb_kvs_handle *pfStack_2e98;
  int iStack_2e8c;
  undefined1 auStack_2e88 [64];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e48;
  fdb_kvs_config fStack_2e20;
  timeval tStack_2e08;
  char acStack_2df8 [256];
  fdb_doc *apfStack_2cf8 [20];
  undefined1 auStack_2c58 [520];
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined4 uStack_2a34;
  undefined1 uStack_2a29;
  undefined1 uStack_2a18;
  undefined8 uStack_29a0;
  size_t sStack_2960;
  size_t sStack_2958;
  fdb_doc **ppfStack_2950;
  char *pcStack_2948;
  code *pcStack_2940;
  code *pcStack_2938;
  fdb_file_handle *pfStack_2920;
  fdb_snapshot_info_t *pfStack_2918;
  uint64_t uStack_2910;
  uint uStack_2904;
  fdb_kvs_handle *apfStack_2900 [4];
  fdb_kvs_config fStack_28e0;
  char acStack_28c8 [8];
  timeval tStack_28c0;
  char acStack_28b0 [256];
  char acStack_27b0 [256];
  char acStack_26b0 [264];
  fdb_config fStack_25a8;
  fdb_doc *apfStack_24b0 [301];
  fdb_kvs_handle **ppfStack_1b48;
  fdb_doc *pfStack_1b40;
  void *pvStack_1b38;
  fdb_kvs_handle *pfStack_1b30;
  btree *pbStack_1b28;
  fdb_kvs_handle *pfStack_1b20;
  fdb_kvs_handle *pfStack_1b08;
  fdb_iterator *pfStack_1b00;
  fdb_kvs_handle *pfStack_1af8;
  undefined1 auStack_1af0 [16];
  undefined1 auStack_1ae0 [40];
  btree bStack_1ab8;
  fdb_kvs_info fStack_1a70;
  fdb_config fStack_1a40;
  char acStack_1948 [256];
  fdb_kvs_handle fStack_1848;
  fdb_kvs_handle **ppfStack_1640;
  fdb_doc *pfStack_1638;
  void *pvStack_1630;
  fdb_kvs_config *pfStack_1628;
  fdb_file_handle **ppfStack_1620;
  fdb_kvs_handle *pfStack_1618;
  fdb_kvs_handle *pfStack_1608;
  fdb_file_handle *pfStack_1600;
  fdb_kvs_config fStack_15f8;
  timeval tStack_15e0;
  fdb_kvs_info fStack_15d0;
  char acStack_15a0 [264];
  fdb_config fStack_1498;
  char acStack_13a0 [256];
  char acStack_12a0 [256];
  fdb_doc *apfStack_11a0 [101];
  fdb_kvs_handle **ppfStack_e78;
  fdb_doc *pfStack_e70;
  void *pvStack_e68;
  fdb_kvs_handle *pfStack_e60;
  btree *pbStack_e58;
  fdb_kvs_handle *pfStack_e50;
  undefined1 auStack_e38 [16];
  fdb_kvs_handle *pfStack_e28;
  fdb_kvs_handle *pfStack_e20;
  btree_kv_ops *pbStack_e18;
  undefined1 auStack_e10 [40];
  docio_handle *pdStack_de8;
  timeval tStack_db0;
  fdb_config fStack_da0;
  fdb_doc afStack_ca8 [3];
  btree abStack_ba8 [14];
  fdb_kvs_handle fStack_888;
  fdb_kvs_handle **ppfStack_580;
  fdb_doc *pfStack_578;
  void *pvStack_570;
  fdb_kvs_handle *pfStack_568;
  btree *pbStack_560;
  fdb_kvs_handle *pfStack_558;
  fdb_kvs_handle *pfStack_548;
  fdb_kvs_handle *pfStack_540;
  fdb_doc *pfStack_538;
  fdb_kvs_handle *pfStack_530;
  fdb_file_handle *pfStack_528;
  undefined1 auStack_520 [32];
  undefined1 auStack_500 [40];
  fdb_file_info fStack_4d8;
  char acStack_490 [264];
  fdb_config fStack_388;
  fdb_kvs_handle fStack_290;
  fdb_doc **ppfStack_88;
  fdb_doc *pfStack_80;
  void *pvStack_78;
  uint64_t uStack_70;
  fdb_file_handle *pfStack_68;
  fdb_kvs_handle *pfStack_60;
  undefined1 local_48 [24];
  
  pfVar12 = (fdb_kvs_handle *)(ulong)status;
  pfStack_60 = (fdb_kvs_handle *)0x10c8eb;
  gettimeofday((timeval *)(local_48 + 8),(__timezone_ptr_t)0x0);
  if ((int)status < 8) {
    if (status == 1) {
      *(undefined1 *)((long)ctx + 8) = 1;
      return 0;
    }
    if (status != 2) goto LAB_0010c97b;
    uVar21 = (uint)doc->deleted;
    pfVar12 = (fdb_kvs_handle *)(ulong)uVar21;
    *(int *)ctx = *ctx + 1;
    doc = (fdb_doc *)local_48;
    pfStack_60 = (fdb_kvs_handle *)0x10c928;
    fdb_doc_create((fdb_doc **)doc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(uint64_t *)(local_48._0_8_ + 0x30) = old_offset;
    pfStack_60 = (fdb_kvs_handle *)0x10c939;
    fVar4 = fdb_get_byoffset(*(fdb_kvs_handle **)((long)ctx + 0x10),(fdb_doc *)local_48._0_8_);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_60 = (fdb_kvs_handle *)0x10c94b;
      fdb_doc_free((fdb_doc *)local_48._0_8_);
      if ((fhandle->root->config).multi_kv_instances == true) {
        if (*(short *)kv_name == 0x6264) {
          return uVar21;
        }
        pfStack_60 = (fdb_kvs_handle *)0x10c96a;
        compaction_cb();
        goto LAB_0010c96a;
      }
      if (*(int *)(kv_name + 3) == 0x746c7561 && *(int *)kv_name == 0x61666564) {
        return uVar21;
      }
      pfStack_60 = (fdb_kvs_handle *)0x10c9fc;
      compaction_cb();
      goto LAB_0010c9fc;
    }
  }
  else {
LAB_0010c96a:
    if ((int)pfVar12 == 8) {
      *(undefined1 *)((long)ctx + 10) = 1;
      return 0;
    }
    if ((int)pfVar12 == 0x10) {
      *(undefined1 *)((long)ctx + 9) = 1;
      return 0;
    }
LAB_0010c97b:
    *(int *)((long)ctx + 4) = *(int *)((long)ctx + 4) + 1;
    kv_name = local_48;
    pfStack_60 = (fdb_kvs_handle *)0x10c9a0;
    fdb_doc_create((fdb_doc **)kv_name,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(uint64_t *)(local_48._0_8_ + 0x30) = old_offset;
    pfStack_60 = (fdb_kvs_handle *)0x10c9b0;
    fVar4 = fdb_get_byoffset(*(fdb_kvs_handle **)((long)ctx + 0x10),(fdb_doc *)local_48._0_8_);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_60 = (fdb_kvs_handle *)0x10c9be;
      fdb_doc_free((fdb_doc *)local_48._0_8_);
      return 0;
    }
LAB_0010c9fc:
    pfStack_60 = (fdb_kvs_handle *)0x10ca01;
    compaction_cb();
  }
  pfStack_60 = (fdb_kvs_handle *)compact_wo_reopen_test;
  compaction_cb();
  pvStack_78 = ctx;
  pfStack_558 = (fdb_kvs_handle *)0x10ca23;
  ppfStack_88 = (fdb_doc **)kv_name;
  pfStack_80 = doc;
  uStack_70 = old_offset;
  pfStack_68 = fhandle;
  pfStack_60 = pfVar12;
  gettimeofday((timeval *)(auStack_500 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_558 = (fdb_kvs_handle *)0x10ca28;
  memleak_start();
  pfStack_558 = (fdb_kvs_handle *)0x10ca34;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_558 = (fdb_kvs_handle *)0x10ca44;
  fdb_get_default_config();
  pfVar7 = (fdb_kvs_handle *)auStack_500;
  pfStack_558 = (fdb_kvs_handle *)0x10ca51;
  fdb_get_default_kvs_config();
  fStack_388.buffercache_size = 0x1000000;
  fStack_388.wal_threshold = 0x400;
  fStack_388.flags = 1;
  fStack_388.compaction_threshold = '\0';
  pbVar31 = (btree *)&pfStack_538;
  pfStack_558 = (fdb_kvs_handle *)0x10ca83;
  fdb_open((fdb_file_handle **)pbVar31,"./compact_test1",&fStack_388);
  ppfVar19 = &pfStack_540;
  pfStack_558 = (fdb_kvs_handle *)0x10ca96;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_538,ppfVar19,(fdb_kvs_config *)pfVar7);
  pfStack_558 = (fdb_kvs_handle *)0x10caac;
  fVar4 = fdb_set_log_callback(pfStack_540,logCallbackFunc,"compact_wo_reopen_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_558 = (fdb_kvs_handle *)0x10cad0;
    fdb_open(&pfStack_528,"./compact_test1",&fStack_388);
    ppfVar19 = &pfStack_530;
    pfStack_558 = (fdb_kvs_handle *)0x10cae5;
    fdb_kvs_open_default(pfStack_528,ppfVar19,(fdb_kvs_config *)auStack_500);
    pfStack_558 = (fdb_kvs_handle *)0x10cafb;
    fVar4 = fdb_set_log_callback(pfStack_530,logCallbackFunc,"compact_wo_reopen_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      doc = (fdb_doc *)0x0;
      uVar16 = 0;
      do {
        pfVar1 = &fStack_290.config.encryption_key;
        pfStack_558 = (fdb_kvs_handle *)0x10cb23;
        sprintf((char *)pfVar1,"key%d",uVar16 & 0xffffffff);
        pfStack_558 = (fdb_kvs_handle *)0x10cb3b;
        sprintf((char *)&fStack_290,"meta%d",uVar16 & 0xffffffff);
        pfStack_558 = (fdb_kvs_handle *)0x10cb53;
        sprintf(acStack_490,"body%d",uVar16 & 0xffffffff);
        pbVar31 = (btree *)(auStack_520 + (long)doc);
        pfStack_558 = (fdb_kvs_handle *)0x10cb63;
        sVar6 = strlen((char *)pfVar1);
        pfVar12 = &fStack_290;
        pfStack_558 = (fdb_kvs_handle *)0x10cb76;
        pfVar7 = (fdb_kvs_handle *)strlen((char *)pfVar12);
        pfStack_558 = (fdb_kvs_handle *)0x10cb86;
        sVar8 = strlen(acStack_490);
        pfStack_558 = (fdb_kvs_handle *)0x10cbab;
        fdb_doc_create((fdb_doc **)pbVar31,&fStack_290.config.encryption_key,sVar6,pfVar12,
                       (size_t)pfVar7,acStack_490,sVar8);
        pfStack_558 = (fdb_kvs_handle *)0x10cbba;
        fdb_set(pfStack_540,*(fdb_doc **)(auStack_520 + uVar16 * 8));
        uVar16 = uVar16 + 1;
        doc = (fdb_doc *)((long)doc + 8);
      } while (uVar16 != 3);
      ctx = (void *)0x0;
      ppfVar19 = &pfStack_548;
      pfStack_558 = (fdb_kvs_handle *)0x10cbfa;
      fdb_doc_create((fdb_doc **)ppfVar19,*(void **)(auStack_520._8_8_ + 0x20),
                     *(size_t *)auStack_520._8_8_,*(void **)(auStack_520._8_8_ + 0x38),
                     *(size_t *)(auStack_520._8_8_ + 8),(void *)0x0,0);
      *(bool *)&pfStack_548->file = true;
      pfStack_558 = (fdb_kvs_handle *)0x10cc0b;
      fdb_set(pfStack_540,(fdb_doc *)pfStack_548);
      pfStack_558 = (fdb_kvs_handle *)0x10cc13;
      fdb_doc_free((fdb_doc *)pfStack_548);
      pfStack_558 = (fdb_kvs_handle *)0x10cc22;
      fdb_commit((fdb_file_handle *)pfStack_538,'\x01');
      pfStack_558 = (fdb_kvs_handle *)0x10cc33;
      fdb_compact((fdb_file_handle *)pfStack_538,"./compact_test2");
      while( true ) {
        pfStack_558 = (fdb_kvs_handle *)0x10cc57;
        fdb_doc_create((fdb_doc **)ppfVar19,(void *)(*(size_t **)(auStack_520 + (long)ctx * 8))[4],
                       **(size_t **)(auStack_520 + (long)ctx * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_558 = (fdb_kvs_handle *)0x10cc66;
        fVar4 = fdb_get(pfStack_530,(fdb_doc *)pfStack_548);
        pfVar14 = pfStack_548;
        if (ctx != (void *)0x1) break;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010cdb5;
LAB_0010cccc:
        pfStack_558 = (fdb_kvs_handle *)0x10ccd4;
        fdb_doc_free((fdb_doc *)pfVar14);
        ctx = (void *)((long)ctx + 1);
        pfVar7 = pfVar14;
        if (ctx == (void *)0x3) {
          pfStack_558 = (fdb_kvs_handle *)0x10ccf3;
          fdb_get_file_info(pfStack_528,&fStack_4d8);
          pfStack_558 = (fdb_kvs_handle *)0x10cd02;
          iVar5 = strcmp("./compact_test2",fStack_4d8.filename);
          if (iVar5 != 0) {
            pfStack_558 = (fdb_kvs_handle *)0x10cd10;
            compact_wo_reopen_test();
          }
          lVar17 = 0;
          do {
            pfStack_558 = (fdb_kvs_handle *)0x10cd1c;
            fdb_doc_free(*(fdb_doc **)(auStack_520 + lVar17 * 8));
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          pfStack_558 = (fdb_kvs_handle *)0x10cd2f;
          fdb_kvs_close(pfStack_540);
          pfStack_558 = (fdb_kvs_handle *)0x10cd39;
          fdb_kvs_close(pfStack_530);
          pfStack_558 = (fdb_kvs_handle *)0x10cd43;
          fdb_close((fdb_file_handle *)pfStack_538);
          pfStack_558 = (fdb_kvs_handle *)0x10cd4d;
          fdb_close(pfStack_528);
          pfStack_558 = (fdb_kvs_handle *)0x10cd52;
          fdb_shutdown();
          pfStack_558 = (fdb_kvs_handle *)0x10cd57;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (compact_wo_reopen_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_558 = (fdb_kvs_handle *)0x10cd88;
          iVar5 = fprintf(_stderr,pcVar23,"compaction without reopen test");
          return iVar5;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar31 = pfStack_548->staletree;
        pfVar12 = *(fdb_kvs_handle **)(auStack_520 + (long)ctx * 8);
        doc = (fdb_doc *)pfVar12->staletree;
        pfStack_558 = (fdb_kvs_handle *)0x10cca5;
        iVar5 = bcmp(pbVar31,doc,(size_t)(pfStack_548->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar31 = (pfVar14->field_6).seqtree;
          doc = (fdb_doc *)(pfVar12->field_6).seqtree;
          pfStack_558 = (fdb_kvs_handle *)0x10ccc4;
          iVar5 = bcmp(pbVar31,doc,(size_t)(pfVar14->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010cccc;
          pfStack_558 = (fdb_kvs_handle *)0x10cda5;
          compact_wo_reopen_test();
          pfVar7 = pfVar14;
          goto LAB_0010cda5;
        }
      }
      else {
LAB_0010cda5:
        pfVar14 = pfVar7;
        pfStack_558 = (fdb_kvs_handle *)0x10cdaa;
        compact_wo_reopen_test();
      }
      pfStack_558 = (fdb_kvs_handle *)0x10cdb5;
      compact_wo_reopen_test();
      pfVar7 = pfVar14;
LAB_0010cdb5:
      pfStack_558 = (fdb_kvs_handle *)0x10cdba;
      compact_wo_reopen_test();
      goto LAB_0010cdba;
    }
  }
  else {
LAB_0010cdba:
    pfStack_558 = (fdb_kvs_handle *)0x10cdbf;
    compact_wo_reopen_test();
  }
  pfStack_558 = (fdb_kvs_handle *)compact_with_reopen_test;
  compact_wo_reopen_test();
  pfStack_e50 = (fdb_kvs_handle *)0x10cde4;
  ppfStack_580 = ppfVar19;
  pfStack_578 = doc;
  pvStack_570 = ctx;
  pfStack_568 = pfVar7;
  pbStack_560 = pbVar31;
  pfStack_558 = pfVar12;
  gettimeofday(&tStack_db0,(__timezone_ptr_t)0x0);
  pfStack_e50 = (fdb_kvs_handle *)0x10cde9;
  memleak_start();
  pfStack_e50 = (fdb_kvs_handle *)0x10cdf5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_e50 = (fdb_kvs_handle *)0x10ce05;
  fdb_get_default_config();
  pfVar7 = (fdb_kvs_handle *)auStack_e10;
  pfStack_e50 = (fdb_kvs_handle *)0x10ce12;
  fdb_get_default_kvs_config();
  fStack_da0.buffercache_size = 0x1000000;
  fStack_da0.wal_threshold = 0x400;
  fStack_da0.flags = 1;
  fStack_da0.compaction_threshold = '\0';
  pbVar31 = (btree *)auStack_e38;
  pfStack_e50 = (fdb_kvs_handle *)0x10ce44;
  fdb_open((fdb_file_handle **)pbVar31,"./compact_test1",&fStack_da0);
  ppfVar19 = (fdb_kvs_handle **)(auStack_e38 + 8);
  pfStack_e50 = (fdb_kvs_handle *)0x10ce57;
  fdb_kvs_open_default((fdb_file_handle *)auStack_e38._0_8_,ppfVar19,(fdb_kvs_config *)pfVar7);
  pfStack_e50 = (fdb_kvs_handle *)0x10ce6d;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d61b;
  doc = (fdb_doc *)0x0;
  uVar16 = 0;
  do {
    pfVar1 = &fStack_888.config.encryption_key;
    pfStack_e50 = (fdb_kvs_handle *)0x10ce95;
    sprintf((char *)pfVar1,"key%d",uVar16 & 0xffffffff);
    pfStack_e50 = (fdb_kvs_handle *)0x10cead;
    sprintf((char *)&fStack_888,"meta%d",uVar16 & 0xffffffff);
    pfStack_e50 = (fdb_kvs_handle *)0x10cec5;
    sprintf((char *)afStack_ca8,"body%d",uVar16 & 0xffffffff);
    pbVar31 = (btree *)(&abStack_ba8[0].ksize + (long)doc);
    pfStack_e50 = (fdb_kvs_handle *)0x10ced8;
    ctx = (void *)strlen((char *)pfVar1);
    pfVar12 = &fStack_888;
    pfStack_e50 = (fdb_kvs_handle *)0x10ceeb;
    sVar6 = strlen((char *)pfVar12);
    pfStack_e50 = (fdb_kvs_handle *)0x10cefb;
    sVar8 = strlen((char *)afStack_ca8);
    pfStack_e50 = (fdb_kvs_handle *)0x10cf20;
    fdb_doc_create((fdb_doc **)pbVar31,&fStack_888.config.encryption_key,(size_t)ctx,pfVar12,sVar6,
                   afStack_ca8,sVar8);
    pfStack_e50 = (fdb_kvs_handle *)0x10cf32;
    fdb_set((fdb_kvs_handle *)auStack_e38._8_8_,*(fdb_doc **)(&abStack_ba8[0].ksize + uVar16 * 8));
    uVar16 = uVar16 + 1;
    doc = (fdb_doc *)((long)doc + 8);
  } while (uVar16 != 100);
  pfStack_e50 = (fdb_kvs_handle *)0x10cf72;
  fdb_doc_create((fdb_doc **)&pfStack_e28,*(void **)(abStack_ba8[0].root_bid + 0x20),
                 *(size_t *)abStack_ba8[0].root_bid,*(void **)(abStack_ba8[0].root_bid + 0x38),
                 *(size_t *)(abStack_ba8[0].root_bid + 8),(void *)0x0,0);
  *(undefined1 *)&pfStack_e28->file = 1;
  ppfVar19 = (fdb_kvs_handle **)(auStack_e38 + 8);
  pfStack_e50 = (fdb_kvs_handle *)0x10cf86;
  fdb_set((fdb_kvs_handle *)auStack_e38._8_8_,(fdb_doc *)pfStack_e28);
  pfStack_e50 = (fdb_kvs_handle *)0x10cf8e;
  fdb_doc_free((fdb_doc *)pfStack_e28);
  pfVar7 = (fdb_kvs_handle *)auStack_e38;
  pfStack_e50 = (fdb_kvs_handle *)0x10cfa0;
  fdb_commit((fdb_file_handle *)auStack_e38._0_8_,'\x01');
  pfStack_e50 = (fdb_kvs_handle *)0x10cfaf;
  fdb_compact((fdb_file_handle *)auStack_e38._0_8_,"./compact_test2");
  pfStack_e50 = (fdb_kvs_handle *)0x10cfb7;
  fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10cfbf;
  fdb_close((fdb_file_handle *)auStack_e38._0_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10cfcb;
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  pfStack_e50 = (fdb_kvs_handle *)0x10cfe2;
  fdb_open((fdb_file_handle **)pfVar7,"./compact_test1",&fStack_da0);
  pfStack_e50 = (fdb_kvs_handle *)0x10cff2;
  fdb_kvs_open_default((fdb_file_handle *)auStack_e38._0_8_,ppfVar19,(fdb_kvs_config *)auStack_e10);
  pfStack_e50 = (fdb_kvs_handle *)0x10d008;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d620;
  ctx = (void *)0x0;
  do {
    pfStack_e50 = (fdb_kvs_handle *)0x10d03f;
    fdb_doc_create((fdb_doc **)&pfStack_e28,
                   (void *)(*(size_t **)(&abStack_ba8[0].ksize + (long)ctx * 8))[4],
                   **(size_t **)(&abStack_ba8[0].ksize + (long)ctx * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_e50 = (fdb_kvs_handle *)0x10d04e;
    fVar4 = fdb_get((fdb_kvs_handle *)auStack_e38._8_8_,(fdb_doc *)pfStack_e28);
    pfVar14 = pfStack_e28;
    if (ctx == (void *)0x1) {
      if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010d616;
    }
    else {
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d606;
      pbVar31 = pfStack_e28->staletree;
      pfVar12 = *(fdb_kvs_handle **)(&abStack_ba8[0].ksize + (long)ctx * 8);
      doc = (fdb_doc *)pfVar12->staletree;
      pfStack_e50 = (fdb_kvs_handle *)0x10d090;
      iVar5 = bcmp(pbVar31,doc,(size_t)(pfStack_e28->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010d60b;
      pbVar31 = (pfVar14->field_6).seqtree;
      doc = (fdb_doc *)(pfVar12->field_6).seqtree;
      pfStack_e50 = (fdb_kvs_handle *)0x10d0af;
      iVar5 = bcmp(pbVar31,doc,(size_t)(pfVar14->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010d5fb;
    }
    pfStack_e50 = (fdb_kvs_handle *)0x10d0bf;
    fdb_doc_free((fdb_doc *)pfVar14);
    ctx = (void *)((long)ctx + 1);
    pfVar7 = pfVar14;
  } while (ctx != (void *)0x64);
  pfStack_e50 = (fdb_kvs_handle *)0x10d0de;
  fdb_get_file_info((fdb_file_handle *)auStack_e38._0_8_,(fdb_file_info *)(auStack_e10 + 0x18));
  pfStack_e50 = (fdb_kvs_handle *)0x10d0ed;
  iVar5 = strcmp("./compact_test1",(char *)auStack_e10._24_8_);
  if (iVar5 != 0) {
    pfStack_e50 = (fdb_kvs_handle *)0x10d0fb;
    compact_with_reopen_test();
  }
  pfVar7 = &fStack_888;
  doc = afStack_ca8;
  ctx = (void *)0x0;
  uVar16 = 0;
  do {
    pfStack_e50 = (fdb_kvs_handle *)0x10d123;
    sprintf((char *)pfVar7,"newmeta%d",uVar16 & 0xffffffff);
    pfStack_e50 = (fdb_kvs_handle *)0x10d13e;
    sprintf((char *)doc,"newbody%d_%s",uVar16 & 0xffffffff,&fStack_888.bub_ctx.handle);
    pfStack_e50 = (fdb_kvs_handle *)0x10d151;
    pbVar31 = (btree *)strlen((char *)pfVar7);
    pfStack_e50 = (fdb_kvs_handle *)0x10d15c;
    sVar6 = strlen((char *)doc);
    pfStack_e50 = (fdb_kvs_handle *)0x10d170;
    fdb_doc_update((fdb_doc **)(&abStack_ba8[0].ksize + (long)ctx),pfVar7,(size_t)pbVar31,doc,sVar6)
    ;
    pfStack_e50 = (fdb_kvs_handle *)0x10d182;
    fdb_set((fdb_kvs_handle *)auStack_e38._8_8_,*(fdb_doc **)(&abStack_ba8[0].ksize + uVar16 * 8));
    uVar16 = uVar16 + 1;
    ctx = (void *)((long)ctx + 8);
  } while (uVar16 != 100);
  pfStack_e50 = (fdb_kvs_handle *)0x10d1ab;
  fdb_open((fdb_file_handle **)&pbStack_e18,"./compact_test1",&fStack_da0);
  ppfVar19 = &pfStack_e20;
  pfStack_e50 = (fdb_kvs_handle *)0x10d1c0;
  fdb_kvs_open_default((fdb_file_handle *)pbStack_e18,ppfVar19,(fdb_kvs_config *)auStack_e10);
  pfStack_e50 = (fdb_kvs_handle *)0x10d1d6;
  fVar4 = fdb_set_log_callback(pfStack_e20,logCallbackFunc,"compact_with_reopen_test");
  pfVar12 = (fdb_kvs_handle *)0x64;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d625;
  pfStack_e50 = (fdb_kvs_handle *)0x10d1ea;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d62a;
  pfStack_e50 = (fdb_kvs_handle *)0x10d1fe;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d62f;
  pfStack_e50 = (fdb_kvs_handle *)0x10d212;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d634;
  pfStack_e50 = (fdb_kvs_handle *)0x10d224;
  fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d22e;
  fdb_close((fdb_file_handle *)auStack_e38._0_8_);
  ctx = (void *)0x0;
  ppfVar19 = &pfStack_e28;
  pfVar27 = pfVar7;
  do {
    pfStack_e50 = (fdb_kvs_handle *)0x10d25d;
    fdb_doc_create((fdb_doc **)ppfVar19,
                   (void *)(*(size_t **)(&abStack_ba8[0].ksize + (long)ctx * 8))[4],
                   **(size_t **)(&abStack_ba8[0].ksize + (long)ctx * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_e50 = (fdb_kvs_handle *)0x10d26c;
    fVar4 = fdb_get(pfStack_e20,(fdb_doc *)pfStack_e28);
    pfVar7 = pfStack_e28;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pfStack_e50 = (fdb_kvs_handle *)0x10d5ca;
      compact_with_reopen_test();
LAB_0010d5ca:
      pfStack_e50 = (fdb_kvs_handle *)0x10d5d5;
      compact_with_reopen_test();
LAB_0010d5d5:
      pfStack_e50 = (fdb_kvs_handle *)0x10d5e0;
      compact_with_reopen_test();
      goto LAB_0010d5e0;
    }
    pbVar31 = pfStack_e28->staletree;
    pfVar12 = *(fdb_kvs_handle **)(&abStack_ba8[0].ksize + (long)ctx * 8);
    doc = (fdb_doc *)pfVar12->staletree;
    pfStack_e50 = (fdb_kvs_handle *)0x10d298;
    iVar5 = bcmp(pbVar31,doc,(size_t)(pfStack_e28->kvs_config).custom_cmp);
    pfVar27 = pfVar7;
    if (iVar5 != 0) goto LAB_0010d5ca;
    pbVar31 = (pfVar7->field_6).seqtree;
    doc = (fdb_doc *)(pfVar12->field_6).seqtree;
    pfStack_e50 = (fdb_kvs_handle *)0x10d2b7;
    iVar5 = bcmp(pbVar31,doc,(size_t)(pfVar7->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d5d5;
    pfStack_e50 = (fdb_kvs_handle *)0x10d2c7;
    fdb_doc_free((fdb_doc *)pfVar7);
    ctx = (void *)((long)ctx + 1);
  } while (ctx != (void *)0x64);
  pfStack_e50 = (fdb_kvs_handle *)0x10d2ed;
  fVar4 = fdb_open((fdb_file_handle **)auStack_e38,"./compact_test1",&fStack_da0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d639;
  pfStack_e50 = (fdb_kvs_handle *)0x10d309;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_e38._0_8_,(fdb_kvs_handle **)(auStack_e38 + 8),
                     (fdb_kvs_config *)auStack_e10);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d63e;
  pfStack_e50 = (fdb_kvs_handle *)0x10d329;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d643;
  pfStack_e50 = (fdb_kvs_handle *)0x10d343;
  fdb_get_file_info((fdb_file_handle *)auStack_e38._0_8_,(fdb_file_info *)(auStack_e10 + 0x18));
  pfStack_e50 = (fdb_kvs_handle *)0x10d352;
  iVar5 = strcmp("./compact_test1.3",(char *)auStack_e10._24_8_);
  if (iVar5 != 0) {
    pfStack_e50 = (fdb_kvs_handle *)0x10d360;
    compact_with_reopen_test();
  }
  pfStack_e50 = (fdb_kvs_handle *)0x10d36a;
  fdb_kvs_close(pfStack_e20);
  pfStack_e50 = (fdb_kvs_handle *)0x10d374;
  fdb_close((fdb_file_handle *)pbStack_e18);
  ctx = (void *)0x0;
  do {
    pfStack_e50 = (fdb_kvs_handle *)0x10d3a3;
    fdb_doc_create((fdb_doc **)&pfStack_e28,
                   (void *)(*(size_t **)(&abStack_ba8[0].ksize + (long)ctx * 8))[4],
                   **(size_t **)(&abStack_ba8[0].ksize + (long)ctx * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_e50 = (fdb_kvs_handle *)0x10d3b2;
    fVar4 = fdb_get((fdb_kvs_handle *)auStack_e38._8_8_,(fdb_doc *)pfStack_e28);
    pfVar14 = pfStack_e28;
    pfVar27 = pfVar7;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5e0;
    pbVar31 = pfStack_e28->staletree;
    pfVar12 = *(fdb_kvs_handle **)(&abStack_ba8[0].ksize + (long)ctx * 8);
    doc = (fdb_doc *)pfVar12->staletree;
    pfStack_e50 = (fdb_kvs_handle *)0x10d3de;
    iVar5 = bcmp(pbVar31,doc,(size_t)(pfStack_e28->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0010d5e5;
    pbVar31 = (pfVar14->field_6).seqtree;
    doc = (fdb_doc *)(pfVar12->field_6).seqtree;
    pfStack_e50 = (fdb_kvs_handle *)0x10d3fd;
    iVar5 = bcmp(pbVar31,doc,(size_t)(pfVar14->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d5f0;
    pfStack_e50 = (fdb_kvs_handle *)0x10d40d;
    fdb_doc_free((fdb_doc *)pfVar14);
    ctx = (void *)((long)ctx + 1);
    pfVar7 = pfVar14;
  } while (ctx != (void *)0x64);
  ppfVar19 = (fdb_kvs_handle **)auStack_e38;
  pfStack_e50 = (fdb_kvs_handle *)0x10d429;
  fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  pfVar7 = (fdb_kvs_handle *)(auStack_e38 + 8);
  pfStack_e50 = (fdb_kvs_handle *)0x10d436;
  fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d43e;
  fdb_close((fdb_file_handle *)auStack_e38._0_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d44a;
  system("mv  compact_test1 compact_test.fdb > errorlog.txt");
  pfStack_e50 = (fdb_kvs_handle *)0x10d461;
  fdb_open((fdb_file_handle **)ppfVar19,"./compact_test.fdb",&fStack_da0);
  pfStack_e50 = (fdb_kvs_handle *)0x10d471;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_e38._0_8_,(fdb_kvs_handle **)pfVar7,
             (fdb_kvs_config *)auStack_e10);
  pfStack_e50 = (fdb_kvs_handle *)0x10d487;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d648;
  ppfVar19 = (fdb_kvs_handle **)auStack_e38;
  pfStack_e50 = (fdb_kvs_handle *)0x10d49e;
  fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  pfStack_e50 = (fdb_kvs_handle *)0x10d4a8;
  fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d4b0;
  fdb_close((fdb_file_handle *)auStack_e38._0_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d4c7;
  fVar4 = fdb_open((fdb_file_handle **)ppfVar19,"./compact_test.fdb",&fStack_da0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d64d;
  pfStack_e50 = (fdb_kvs_handle *)0x10d4e3;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_e38._0_8_,(fdb_kvs_handle **)(auStack_e38 + 8),
                     (fdb_kvs_config *)auStack_e10);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d652;
  pfStack_e50 = (fdb_kvs_handle *)0x10d503;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_e50 = (fdb_kvs_handle *)0x10d51d;
    fdb_get_file_info((fdb_file_handle *)auStack_e38._0_8_,(fdb_file_info *)(auStack_e10 + 0x18));
    pfStack_e50 = (fdb_kvs_handle *)0x10d52c;
    iVar5 = strcmp("./compact_test.fdb",(char *)auStack_e10._24_8_);
    if (iVar5 != 0) {
      pfStack_e50 = (fdb_kvs_handle *)0x10d53a;
      compact_with_reopen_test();
    }
    if (pdStack_de8 != (docio_handle *)0x64) {
      pfStack_e50 = (fdb_kvs_handle *)0x10d54c;
      compact_with_reopen_test();
    }
    lVar17 = 0;
    do {
      pfStack_e50 = (fdb_kvs_handle *)0x10d55b;
      fdb_doc_free(*(fdb_doc **)(&abStack_ba8[0].ksize + lVar17 * 8));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 100);
    pfStack_e50 = (fdb_kvs_handle *)0x10d56e;
    fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
    pfStack_e50 = (fdb_kvs_handle *)0x10d578;
    fdb_close((fdb_file_handle *)auStack_e38._0_8_);
    pfStack_e50 = (fdb_kvs_handle *)0x10d57d;
    fdb_shutdown();
    pfStack_e50 = (fdb_kvs_handle *)0x10d582;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_with_reopen_test()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_e50 = (fdb_kvs_handle *)0x10d5b3;
    iVar5 = fprintf(_stderr,pcVar23,"compaction with reopen test");
    return iVar5;
  }
  goto LAB_0010d657;
LAB_0010eb2a:
  pfStack_2ec0 = (fdb_kvs_handle *)0x10eb2f;
  compact_upto_test();
  pcVar34 = pcVar33;
  goto LAB_0010eb2f;
LAB_001108a3:
  pfStack_18638 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  doc_00._M_i = _Var28._M_i;
LAB_001108ae:
  _Var28._M_i = doc_00._M_i;
  pfStack_18638 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_18638 = (fdb_kvs_handle *)0x1108be;
  pcVar33 = pcVar23;
  compaction_daemon_test();
  doc_00._M_i = _Var28._M_i;
LAB_001108be:
  pfVar14 = (fdb_kvs_handle *)auStack_18610;
  ptr_fhandle = (filemgr *)(auStack_18488 + 0x48);
  pfStack_18638 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
  goto LAB_001108c3;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
LAB_0010d5e0:
  pfVar14 = pfVar27;
  pfStack_e50 = (fdb_kvs_handle *)0x10d5e5;
  compact_with_reopen_test();
LAB_0010d5e5:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5f0;
  compact_with_reopen_test();
LAB_0010d5f0:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5fb;
  compact_with_reopen_test();
LAB_0010d5fb:
  pfStack_e50 = (fdb_kvs_handle *)0x10d606;
  compact_with_reopen_test();
  pfVar7 = pfVar14;
LAB_0010d606:
  pfVar14 = pfVar7;
  pfStack_e50 = (fdb_kvs_handle *)0x10d60b;
  compact_with_reopen_test();
LAB_0010d60b:
  pfStack_e50 = (fdb_kvs_handle *)0x10d616;
  compact_with_reopen_test();
  pfVar7 = pfVar14;
LAB_0010d616:
  ppfVar19 = &pfStack_e28;
  pfStack_e50 = (fdb_kvs_handle *)0x10d61b;
  compact_with_reopen_test();
LAB_0010d61b:
  pfStack_e50 = (fdb_kvs_handle *)0x10d620;
  compact_with_reopen_test();
LAB_0010d620:
  pfStack_e50 = (fdb_kvs_handle *)0x10d625;
  compact_with_reopen_test();
LAB_0010d625:
  pfStack_e50 = (fdb_kvs_handle *)0x10d62a;
  compact_with_reopen_test();
LAB_0010d62a:
  pfStack_e50 = (fdb_kvs_handle *)0x10d62f;
  compact_with_reopen_test();
LAB_0010d62f:
  pfStack_e50 = (fdb_kvs_handle *)0x10d634;
  compact_with_reopen_test();
LAB_0010d634:
  pfStack_e50 = (fdb_kvs_handle *)0x10d639;
  compact_with_reopen_test();
LAB_0010d639:
  pfStack_e50 = (fdb_kvs_handle *)0x10d63e;
  compact_with_reopen_test();
LAB_0010d63e:
  pfStack_e50 = (fdb_kvs_handle *)0x10d643;
  compact_with_reopen_test();
LAB_0010d643:
  pfStack_e50 = (fdb_kvs_handle *)0x10d648;
  compact_with_reopen_test();
LAB_0010d648:
  pfStack_e50 = (fdb_kvs_handle *)0x10d64d;
  compact_with_reopen_test();
LAB_0010d64d:
  pfStack_e50 = (fdb_kvs_handle *)0x10d652;
  compact_with_reopen_test();
LAB_0010d652:
  pfStack_e50 = (fdb_kvs_handle *)0x10d657;
  compact_with_reopen_test();
LAB_0010d657:
  pfStack_e50 = (fdb_kvs_handle *)compact_reopen_named_kvs;
  compact_with_reopen_test();
  pfStack_1618 = (fdb_kvs_handle *)0x10d679;
  ppfStack_e78 = ppfVar19;
  pfStack_e70 = doc;
  pvStack_e68 = ctx;
  pfStack_e60 = pfVar7;
  pbStack_e58 = pbVar31;
  pfStack_e50 = pfVar12;
  gettimeofday(&tStack_15e0,(__timezone_ptr_t)0x0);
  pfStack_1618 = (fdb_kvs_handle *)0x10d67e;
  memleak_start();
  pfStack_1618 = (fdb_kvs_handle *)0x10d68a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1618 = (fdb_kvs_handle *)0x10d69a;
  fdb_get_default_config();
  pfStack_1618 = (fdb_kvs_handle *)0x10d6a7;
  fdb_get_default_kvs_config();
  fStack_1498.wal_threshold = 0x400;
  fStack_1498.flags = 1;
  fStack_1498.compaction_threshold = '\0';
  pfStack_1618 = (fdb_kvs_handle *)0x10d6d1;
  fdb_open(&pfStack_1600,"./compact_test1",&fStack_1498);
  pfStack_1618 = (fdb_kvs_handle *)0x10d6eb;
  fdb_kvs_open(pfStack_1600,&pfStack_1608,"db",&fStack_15f8);
  pfStack_1618 = (fdb_kvs_handle *)0x10d701;
  fVar4 = fdb_set_log_callback(pfStack_1608,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar17 = 0;
    uVar16 = 0;
    do {
      pfStack_1618 = (fdb_kvs_handle *)0x10d729;
      sprintf(acStack_12a0,"key%d",uVar16 & 0xffffffff);
      pfStack_1618 = (fdb_kvs_handle *)0x10d741;
      sprintf(acStack_13a0,"meta%d",uVar16 & 0xffffffff);
      pfStack_1618 = (fdb_kvs_handle *)0x10d756;
      sprintf(acStack_15a0,"body%d",uVar16 & 0xffffffff);
      pfStack_1618 = (fdb_kvs_handle *)0x10d769;
      sVar6 = strlen(acStack_12a0);
      pfStack_1618 = (fdb_kvs_handle *)0x10d77c;
      sVar8 = strlen(acStack_13a0);
      pfStack_1618 = (fdb_kvs_handle *)0x10d789;
      sVar9 = strlen(acStack_15a0);
      pfStack_1618 = (fdb_kvs_handle *)0x10d7ab;
      fdb_doc_create((fdb_doc **)((long)apfStack_11a0 + lVar17),acStack_12a0,sVar6,acStack_13a0,
                     sVar8,acStack_15a0,sVar9);
      pfStack_1618 = (fdb_kvs_handle *)0x10d7bd;
      fdb_set(pfStack_1608,apfStack_11a0[uVar16]);
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 8;
    } while (uVar16 != 100);
    pfStack_1618 = (fdb_kvs_handle *)0x10d7dd;
    fdb_commit(pfStack_1600,'\0');
    pfStack_1618 = (fdb_kvs_handle *)0x10d7e7;
    fdb_compact(pfStack_1600,(char *)0x0);
    pfStack_1618 = (fdb_kvs_handle *)0x10d7fd;
    fdb_get_kvs_info(pfStack_1608,&fStack_15d0);
    lVar17 = (long)(int)fStack_15d0.doc_count;
    pfStack_1618 = (fdb_kvs_handle *)0x10d80a;
    fdb_kvs_close(pfStack_1608);
    pfStack_1618 = (fdb_kvs_handle *)0x10d812;
    fdb_close(pfStack_1600);
    pfStack_1618 = (fdb_kvs_handle *)0x10d829;
    fdb_open(&pfStack_1600,"./compact_test1",&fStack_1498);
    pfStack_1618 = (fdb_kvs_handle *)0x10d840;
    fdb_kvs_open(pfStack_1600,&pfStack_1608,"db",&fStack_15f8);
    pfStack_1618 = (fdb_kvs_handle *)0x10d84c;
    fdb_get_kvs_info(pfStack_1608,&fStack_15d0);
    if (lVar17 != CONCAT44(fStack_15d0.doc_count._4_4_,(int)fStack_15d0.doc_count)) {
      pfStack_1618 = (fdb_kvs_handle *)0x10d85f;
      compact_reopen_named_kvs();
    }
    pfStack_1618 = (fdb_kvs_handle *)0x10d869;
    fdb_kvs_close(pfStack_1608);
    pfStack_1618 = (fdb_kvs_handle *)0x10d873;
    fdb_close(pfStack_1600);
    lVar17 = 0;
    do {
      pfStack_1618 = (fdb_kvs_handle *)0x10d882;
      fdb_doc_free(apfStack_11a0[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 100);
    pfStack_1618 = (fdb_kvs_handle *)0x10d890;
    fdb_shutdown();
    pfStack_1618 = (fdb_kvs_handle *)0x10d895;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_1618 = (fdb_kvs_handle *)0x10d8c6;
    iVar5 = fprintf(_stderr,pcVar23,"compact reopen named kvs");
    return iVar5;
  }
  pfStack_1618 = (fdb_kvs_handle *)compact_reopen_with_iterator;
  compact_reopen_named_kvs();
  pfStack_1b20 = (fdb_kvs_handle *)0x10d8fa;
  ppfStack_1640 = &pfStack_1608;
  pfStack_1638 = doc;
  pvStack_1630 = ctx;
  pfStack_1628 = &fStack_15f8;
  ppfStack_1620 = &pfStack_1600;
  pfStack_1618 = pfVar12;
  gettimeofday((timeval *)(auStack_1ae0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1b20 = (fdb_kvs_handle *)0x10d8ff;
  memleak_start();
  pfStack_1af8 = (fdb_kvs_handle *)0x0;
  pfStack_1b20 = (fdb_kvs_handle *)0x10d914;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1b20 = (fdb_kvs_handle *)0x10d924;
  fdb_get_default_config();
  pfVar7 = (fdb_kvs_handle *)auStack_1ae0;
  pfStack_1b20 = (fdb_kvs_handle *)0x10d931;
  fdb_get_default_kvs_config();
  fStack_1a40.wal_threshold = 0x400;
  fStack_1a40.flags = 1;
  fStack_1a40.compaction_threshold = '\0';
  pbVar31 = (btree *)auStack_1af0;
  pfStack_1b20 = (fdb_kvs_handle *)0x10d95b;
  fdb_open((fdb_file_handle **)pbVar31,"./compact_test1",&fStack_1a40);
  ppfVar19 = &pfStack_1b08;
  pfStack_1b20 = (fdb_kvs_handle *)0x10d975;
  fdb_kvs_open((fdb_file_handle *)auStack_1af0._0_8_,ppfVar19,"db",(fdb_kvs_config *)pfVar7);
  pfStack_1b20 = (fdb_kvs_handle *)0x10d98b;
  pfVar14 = pfStack_1b08;
  fVar4 = fdb_set_log_callback(pfStack_1b08,logCallbackFunc,"compact_reopen_with_iterator");
  uVar21 = (uint)pfVar14;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    doc = (fdb_doc *)0x0;
    uVar16 = 0;
    do {
      pfVar1 = &fStack_1848.config.encryption_key;
      pfStack_1b20 = (fdb_kvs_handle *)0x10d9b3;
      sprintf((char *)pfVar1,"key%d",uVar16 & 0xffffffff);
      pfStack_1b20 = (fdb_kvs_handle *)0x10d9cb;
      sprintf((char *)&fStack_1848,"meta%d",uVar16 & 0xffffffff);
      pfStack_1b20 = (fdb_kvs_handle *)0x10d9e3;
      sprintf(acStack_1948,"body%d",uVar16 & 0xffffffff);
      pbVar31 = (btree *)(&bStack_1ab8.ksize + (long)doc);
      pfStack_1b20 = (fdb_kvs_handle *)0x10d9f3;
      ctx = (void *)strlen((char *)pfVar1);
      pfVar12 = &fStack_1848;
      pfStack_1b20 = (fdb_kvs_handle *)0x10da06;
      pfVar7 = (fdb_kvs_handle *)strlen((char *)pfVar12);
      pfStack_1b20 = (fdb_kvs_handle *)0x10da16;
      sVar6 = strlen(acStack_1948);
      pfStack_1b20 = (fdb_kvs_handle *)0x10da3b;
      fdb_doc_create((fdb_doc **)pbVar31,&fStack_1848.config.encryption_key,(size_t)ctx,pfVar12,
                     (size_t)pfVar7,acStack_1948,sVar6);
      pfStack_1b20 = (fdb_kvs_handle *)0x10da4a;
      fdb_set(pfStack_1b08,*(fdb_doc **)(&bStack_1ab8.ksize + uVar16 * 8));
      uVar16 = uVar16 + 1;
      doc = (fdb_doc *)((long)doc + 8);
    } while (uVar16 != 9);
    pfStack_1b20 = (fdb_kvs_handle *)0x10da67;
    fdb_commit((fdb_file_handle *)auStack_1af0._0_8_,'\0');
    ppfVar19 = (fdb_kvs_handle **)(auStack_1af0 + 8);
    pfStack_1b20 = (fdb_kvs_handle *)0x10da83;
    fdb_open((fdb_file_handle **)ppfVar19,"./compact_test1",&fStack_1a40);
    pfStack_1b20 = (fdb_kvs_handle *)0x10da92;
    pfVar24 = (fdb_file_handle *)auStack_1af0._8_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_1af0._8_8_,"./compact_test2");
    uVar21 = (uint)pfVar24;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dcb5;
    pfStack_1b20 = (fdb_kvs_handle *)0x10daa4;
    fdb_close((fdb_file_handle *)auStack_1af0._8_8_);
    pfStack_1b20 = (fdb_kvs_handle *)0x10dac4;
    pfVar14 = pfStack_1b08;
    fVar4 = fdb_iterator_init(pfStack_1b08,&pfStack_1b00,(void *)0x0,0,(void *)0x0,0,0);
    uVar21 = (uint)pfVar14;
    pfVar14 = pfVar7;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dcba;
    ctx = (void *)0x0;
    ppfVar19 = &pfStack_1af8;
    do {
      pfStack_1b20 = (fdb_kvs_handle *)0x10dae1;
      fVar4 = fdb_iterator_get(pfStack_1b00,(fdb_doc **)ppfVar19);
      pfVar14 = pfStack_1af8;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0010dc95:
        pfStack_1b20 = (fdb_kvs_handle *)0x10dc9a;
        compact_reopen_with_iterator();
LAB_0010dc9a:
        pfStack_1b20 = (fdb_kvs_handle *)0x10dca5;
        compact_reopen_with_iterator();
LAB_0010dca5:
        pfStack_1b20 = (fdb_kvs_handle *)0x10dcb0;
        pfVar26 = doc;
        compact_reopen_with_iterator();
        uVar21 = (uint)pfVar26;
        goto LAB_0010dcb0;
      }
      pbVar31 = (btree *)pfStack_1af8->op_stats;
      pfVar12 = *(fdb_kvs_handle **)(&bStack_1ab8.ksize + (long)ctx * 8);
      doc = (fdb_doc *)pfVar12->op_stats;
      pfStack_1b20 = (fdb_kvs_handle *)0x10db09;
      iVar5 = bcmp(pbVar31,doc,*(size_t *)&pfStack_1af8->kvs_config);
      pfVar7 = pfVar14;
      if (iVar5 != 0) {
        pfStack_1b20 = (fdb_kvs_handle *)0x10dc95;
        compact_reopen_with_iterator();
        goto LAB_0010dc95;
      }
      pbVar31 = pfVar14->staletree;
      doc = (fdb_doc *)pfVar12->staletree;
      pfStack_1b20 = (fdb_kvs_handle *)0x10db28;
      iVar5 = bcmp(pbVar31,doc,(size_t)(pfVar14->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010dca5;
      pbVar31 = (pfVar14->field_6).seqtree;
      doc = (fdb_doc *)(pfVar12->field_6).seqtree;
      pfStack_1b20 = (fdb_kvs_handle *)0x10db47;
      iVar5 = bcmp(pbVar31,doc,(size_t)(pfVar14->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010dc9a;
      pfStack_1b20 = (fdb_kvs_handle *)0x10db57;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_1af8 = (fdb_kvs_handle *)0x0;
      ctx = (void *)((long)ctx + 1);
      pfStack_1b20 = (fdb_kvs_handle *)0x10db6d;
      pfVar25 = pfStack_1b00;
      fVar4 = fdb_iterator_next(pfStack_1b00);
      uVar21 = (uint)pfVar25;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)ctx != 9) goto LAB_0010dcbf;
    pfStack_1b20 = (fdb_kvs_handle *)0x10db8a;
    fVar4 = fdb_iterator_close(pfStack_1b00);
    uVar21 = (uint)pfStack_1b00;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbaa;
      fdb_get_kvs_info(pfStack_1b08,&fStack_1a70);
      lVar17 = (long)(int)fStack_1a70.doc_count;
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbb6;
      fdb_kvs_close(pfStack_1b08);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbc4;
      fdb_close((fdb_file_handle *)auStack_1af0._0_8_);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbdb;
      fdb_open((fdb_file_handle **)auStack_1af0,"./compact_test2",&fStack_1a40);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbf3;
      fdb_kvs_open((fdb_file_handle *)auStack_1af0._0_8_,&pfStack_1b08,"db",
                   (fdb_kvs_config *)auStack_1ae0);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbfe;
      fdb_get_kvs_info(pfStack_1b08,&fStack_1a70);
      if (lVar17 != CONCAT44(fStack_1a70.doc_count._4_4_,(int)fStack_1a70.doc_count)) {
        pfStack_1b20 = (fdb_kvs_handle *)0x10dc14;
        compact_reopen_with_iterator();
      }
      pfStack_1b20 = (fdb_kvs_handle *)0x10dc1e;
      fdb_kvs_close(pfStack_1b08);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dc28;
      fdb_close((fdb_file_handle *)auStack_1af0._0_8_);
      lVar17 = 0;
      do {
        pfStack_1b20 = (fdb_kvs_handle *)0x10dc34;
        fdb_doc_free(*(fdb_doc **)(&bStack_1ab8.ksize + lVar17 * 8));
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dc42;
      fdb_shutdown();
      pfStack_1b20 = (fdb_kvs_handle *)0x10dc47;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_1b20 = (fdb_kvs_handle *)0x10dc78;
      iVar5 = fprintf(_stderr,pcVar23,"compact reopen with iterator");
      return iVar5;
    }
  }
  else {
LAB_0010dcb0:
    pfStack_1b20 = (fdb_kvs_handle *)0x10dcb5;
    compact_reopen_with_iterator();
LAB_0010dcb5:
    pfStack_1b20 = (fdb_kvs_handle *)0x10dcba;
    compact_reopen_with_iterator();
    pfVar14 = pfVar7;
LAB_0010dcba:
    pfStack_1b20 = (fdb_kvs_handle *)0x10dcbf;
    compact_reopen_with_iterator();
LAB_0010dcbf:
    pfStack_1b20 = (fdb_kvs_handle *)0x10dcc4;
    compact_reopen_with_iterator();
  }
  pfStack_1b20 = (fdb_kvs_handle *)estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_2938 = (code *)0x10dceb;
  ppfStack_1b48 = ppfVar19;
  pfStack_1b40 = doc;
  pvStack_1b38 = ctx;
  pfStack_1b30 = pfVar14;
  pbStack_1b28 = pbVar31;
  pfStack_1b20 = pfVar12;
  gettimeofday(&tStack_28c0,(__timezone_ptr_t)0x0);
  pcStack_2938 = (code *)0x10dcf0;
  memleak_start();
  pcStack_2938 = (code *)0x10dd00;
  fdb_get_default_config();
  pcStack_2938 = (code *)0x10dd0a;
  fdb_get_default_kvs_config();
  fStack_25a8.buffercache_size = 0;
  fStack_25a8.wal_threshold = 0x32;
  fStack_25a8.flags = 1;
  fStack_25a8.compaction_threshold = '\0';
  fStack_25a8.block_reusing_threshold = 0;
  pcStack_2938 = (code *)0x10dd38;
  fStack_25a8.multi_kv_instances = (bool)(char)uVar21;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_2938 = (code *)0x10dd4c;
  fdb_open(&pfStack_2920,"./compact_test1",&fStack_25a8);
  uStack_2904 = uVar21;
  if (uVar21 == 0) {
    pcStack_2938 = (code *)0x10ddb8;
    fdb_kvs_open_default(pfStack_2920,apfStack_2900,&fStack_28e0);
    sVar18 = 1;
  }
  else {
    ppfVar19 = apfStack_2900;
    uVar16 = 0;
    do {
      pcStack_2938 = (code *)0x10dd7d;
      sprintf(acStack_28c8,"kv%d",uVar16 & 0xffffffff);
      pcStack_2938 = (code *)0x10dd90;
      fdb_kvs_open(pfStack_2920,ppfVar19,acStack_28c8,&fStack_28e0);
      uVar16 = uVar16 + 1;
      ppfVar19 = ppfVar19 + 1;
    } while (uVar16 != 4);
    sVar18 = 4;
  }
  uVar16 = 0;
  do {
    pcStack_2938 = (code *)0x10dddc;
    sprintf(acStack_26b0,"key%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10ddf5;
    sprintf(acStack_27b0,"meta%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10de0e;
    sprintf(acStack_28b0,"body%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10de21;
    sVar6 = strlen(acStack_26b0);
    pcStack_2938 = (code *)0x10de34;
    sVar8 = strlen(acStack_27b0);
    pcStack_2938 = (code *)0x10de44;
    sVar9 = strlen(acStack_28b0);
    pcStack_2938 = (code *)0x10de69;
    fdb_doc_create(apfStack_24b0 + uVar16,acStack_26b0,sVar6,acStack_27b0,sVar8,acStack_28b0,sVar9);
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10de7a;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[uVar16]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x4b);
  pcStack_2938 = (code *)0x10de9e;
  fdb_commit(pfStack_2920,'\x01');
  uVar16 = 0x4b;
  do {
    pcStack_2938 = (code *)0x10dec0;
    sprintf(acStack_26b0,"key%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10ded9;
    sprintf(acStack_27b0,"meta%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10def2;
    sprintf(acStack_28b0,"body%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10df05;
    sVar6 = strlen(acStack_26b0);
    pcStack_2938 = (code *)0x10df18;
    sVar8 = strlen(acStack_27b0);
    pcStack_2938 = (code *)0x10df28;
    sVar9 = strlen(acStack_28b0);
    pcStack_2938 = (code *)0x10df4d;
    fdb_doc_create(apfStack_24b0 + uVar16,acStack_26b0,sVar6,acStack_27b0,sVar8,acStack_28b0,sVar9);
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10df5e;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[uVar16]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x96);
  lVar17 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10df8e;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[lVar17]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x4b);
  lVar17 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10dfb7;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[lVar17]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x4b);
  pcStack_2938 = (code *)0x10dfd4;
  fdb_commit(pfStack_2920,'\0');
  uVar16 = 0x96;
  do {
    pcStack_2938 = (code *)0x10dff6;
    sprintf(acStack_26b0,"key%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10e00f;
    sprintf(acStack_27b0,"meta%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10e028;
    sprintf(acStack_28b0,"body%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10e03b;
    sVar6 = strlen(acStack_26b0);
    pcStack_2938 = (code *)0x10e04e;
    sVar8 = strlen(acStack_27b0);
    pcStack_2938 = (code *)0x10e05e;
    sVar9 = strlen(acStack_28b0);
    pcStack_2938 = (code *)0x10e083;
    fdb_doc_create(apfStack_24b0 + uVar16,acStack_26b0,sVar6,acStack_27b0,sVar8,acStack_28b0,sVar9);
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10e094;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[uVar16]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0xe1);
  pcStack_2938 = (code *)0x10e0bb;
  fdb_commit(pfStack_2920,'\x01');
  uVar16 = 0xe1;
  do {
    pcStack_2938 = (code *)0x10e0dd;
    sprintf(acStack_26b0,"key%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10e0f6;
    sprintf(acStack_27b0,"meta%d",uVar16 & 0xffffffff);
    pcStack_2938 = (code *)0x10e10f;
    sprintf(acStack_28b0,"body%d",uVar16 & 0xffffffff);
    ppfVar35 = apfStack_24b0 + uVar16;
    pcStack_2938 = (code *)0x10e122;
    sVar6 = strlen(acStack_26b0);
    pcStack_2938 = (code *)0x10e135;
    sVar8 = strlen(acStack_27b0);
    pcStack_2938 = (code *)0x10e145;
    sVar9 = strlen(acStack_28b0);
    pcStack_2938 = (code *)0x10e16a;
    fdb_doc_create(ppfVar35,acStack_26b0,sVar6,acStack_27b0,sVar8,acStack_28b0,sVar9);
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10e17b;
      fdb_set(apfStack_2900[sVar32],*ppfVar35);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 300);
  sVar32 = 0;
  pcStack_2938 = (code *)0x10e1a2;
  fdb_commit(pfStack_2920,'\0');
  do {
    pfVar12 = apfStack_2900[sVar32];
    pcStack_2938 = (code *)0x10e1c0;
    fVar4 = fdb_set_log_callback(pfVar12,logCallbackFunc,"estimate_space_upto_test");
    iVar5 = (int)pfVar12;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcStack_2938 = (code *)0x10e337;
      estimate_space_upto_test();
      goto LAB_0010e337;
    }
    sVar32 = sVar32 + 1;
  } while (sVar18 != sVar32);
  pcStack_2938 = (code *)0x10e1e4;
  pfVar24 = pfStack_2920;
  fVar4 = fdb_get_all_snap_markers(pfStack_2920,&pfStack_2918,&uStack_2910);
  iVar5 = (int)pfVar24;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    sVar6 = (size_t)uStack_2904;
    cVar20 = (char)uStack_2904;
    uVar11 = uStack_2910;
    if (cVar20 != '\0') {
      if (uStack_2910 != 8) {
        pcStack_2938 = (code *)0x10e20a;
        estimate_space_upto_test();
      }
      pcStack_2938 = (code *)0x10e21d;
      sVar18 = fdb_estimate_space_used_from(pfStack_2920,pfStack_2918[1].marker);
      pcStack_2938 = (code *)0x10e233;
      sVar10 = fdb_estimate_space_used_from(pfStack_2920,pfStack_2918[2].marker);
      if (sVar10 <= sVar18) {
        pcStack_2938 = (code *)0x10e23d;
        estimate_space_upto_test();
        uVar11 = extraout_RAX;
        goto LAB_0010e23d;
      }
LAB_0010e27f:
      pcStack_2938 = (code *)0x10e28e;
      fVar4 = fdb_free_snap_markers(pfStack_2918,uStack_2910);
      iVar5 = (int)pfStack_2918;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pcStack_2938 = (code *)0x10e2a0;
        fdb_close(pfStack_2920);
        lVar17 = 0;
        do {
          pcStack_2938 = (code *)0x10e2af;
          fdb_doc_free(apfStack_24b0[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 300);
        pcStack_2938 = (code *)0x10e2c0;
        fdb_shutdown();
        pcStack_2938 = (code *)0x10e2c5;
        memleak_end();
        pcVar23 = "single kv mode:";
        if (cVar20 != '\0') {
          pcVar23 = "multiple kv mode:";
        }
        pcStack_2938 = (code *)0x10e2f3;
        sprintf(acStack_28b0,"estimate space upto marker in file test %s",pcVar23);
        pcVar23 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pcStack_2938 = (code *)0x10e320;
        iVar5 = fprintf(_stderr,pcVar23,acStack_28b0);
        return iVar5;
      }
      goto LAB_0010e33c;
    }
LAB_0010e23d:
    if (uVar11 != 4) {
      pcStack_2938 = (code *)0x10e24d;
      estimate_space_upto_test();
    }
    pcStack_2938 = (code *)0x10e260;
    sVar18 = fdb_estimate_space_used_from(pfStack_2920,pfStack_2918[1].marker);
    pcStack_2938 = (code *)0x10e276;
    pfVar24 = pfStack_2920;
    sVar10 = fdb_estimate_space_used_from(pfStack_2920,pfStack_2918[2].marker);
    iVar5 = (int)pfVar24;
    if (sVar18 < sVar10) goto LAB_0010e27f;
  }
  else {
LAB_0010e337:
    pcStack_2938 = (code *)0x10e33c;
    estimate_space_upto_test();
LAB_0010e33c:
    pcStack_2938 = (code *)0x10e341;
    estimate_space_upto_test();
  }
  pcStack_2938 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_2940 = logCallbackFunc;
  pcStack_2948 = "estimate_space_upto_test";
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e36b;
  sStack_2960 = sVar18;
  sStack_2958 = sVar32;
  ppfStack_2950 = ppfVar35;
  pcStack_2938 = (code *)sVar6;
  gettimeofday(&tStack_2e08,(__timezone_ptr_t)0x0);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e370;
  memleak_start();
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e380;
  fdb_get_default_config();
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e38d;
  fdb_get_default_kvs_config();
  uStack_2a50 = 0;
  uStack_2a48 = 0x400;
  uStack_2a34 = 1;
  uStack_2a29 = 0;
  uStack_29a0 = 0;
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e3bb;
  uStack_2a18 = (char)iVar5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e3cf;
  fdb_open(&pfStack_2ea0,"./compact_test1",(fdb_config *)(auStack_2c58 + 0x200));
  iStack_2e8c = iVar5;
  if (iVar5 == 0) {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e441;
    fdb_kvs_open_default(pfStack_2ea0,(fdb_kvs_handle **)(auStack_2e88 + 0x20),&fStack_2e20);
    uVar21 = 1;
  }
  else {
    ppfVar19 = (fdb_kvs_handle **)(auStack_2e88 + 0x20);
    uVar16 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e403;
      sprintf(auStack_2e88,"kv%d",uVar16 & 0xffffffff);
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e416;
      fdb_kvs_open(pfStack_2ea0,ppfVar19,auStack_2e88,&fStack_2e20);
      uVar16 = uVar16 + 1;
      ppfVar19 = ppfVar19 + 1;
    } while (uVar16 != 4);
    uVar21 = 4;
  }
  pcVar23 = (char *)(ulong)uVar21;
  uVar16 = 0;
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e466;
    sprintf(auStack_2c58 + 0x100,"key%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e47e;
    sprintf(auStack_2c58,"meta%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e496;
    sprintf(acStack_2df8,"body%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e4a9;
    sVar6 = strlen(auStack_2c58 + 0x100);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e4bc;
    sVar8 = strlen(auStack_2c58);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e4cc;
    sVar9 = strlen(acStack_2df8);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e4f1;
    fdb_doc_create(apfStack_2cf8 + uVar16,auStack_2c58 + 0x100,sVar6,auStack_2c58,sVar8,acStack_2df8
                   ,sVar9);
    lVar17 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e501;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e88 + lVar17 * 8 + 0x20),apfStack_2cf8[uVar16]);
      lVar17 = lVar17 + 1;
    } while (pcVar23 != (char *)lVar17);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 5);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e525;
  fdb_commit(pfStack_2ea0,'\x01');
  uVar16 = 5;
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e545;
    sprintf(auStack_2c58 + 0x100,"key%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e55d;
    sprintf(auStack_2c58,"meta%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e575;
    sprintf(acStack_2df8,"body%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e588;
    sVar6 = strlen(auStack_2c58 + 0x100);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e59b;
    sVar8 = strlen(auStack_2c58);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e5ab;
    sVar9 = strlen(acStack_2df8);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e5d0;
    fdb_doc_create(apfStack_2cf8 + uVar16,auStack_2c58 + 0x100,sVar6,auStack_2c58,sVar8,acStack_2df8
                   ,sVar9);
    lVar17 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e5e1;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e88 + lVar17 * 8 + 0x20),apfStack_2cf8[uVar16]);
      lVar17 = lVar17 + 1;
    } while (pcVar23 != (char *)lVar17);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 10);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e602;
  fdb_commit(pfStack_2ea0,'\0');
  uVar16 = 10;
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e622;
    sprintf(auStack_2c58 + 0x100,"key%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e63a;
    sprintf(auStack_2c58,"meta%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e652;
    sprintf(acStack_2df8,"body%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e665;
    sVar6 = strlen(auStack_2c58 + 0x100);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e678;
    sVar8 = strlen(auStack_2c58);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e688;
    sVar9 = strlen(acStack_2df8);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e6ad;
    fdb_doc_create(apfStack_2cf8 + uVar16,auStack_2c58 + 0x100,sVar6,auStack_2c58,sVar8,acStack_2df8
                   ,sVar9);
    lVar17 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e6be;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e88 + lVar17 * 8 + 0x20),apfStack_2cf8[uVar16]);
      lVar17 = lVar17 + 1;
    } while (pcVar23 != (char *)lVar17);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0xf);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e6e2;
  fdb_commit(pfStack_2ea0,'\x01');
  uVar16 = 0xf;
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e702;
    sprintf(auStack_2c58 + 0x100,"key%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e71a;
    sprintf(auStack_2c58,"meta%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e732;
    sprintf(acStack_2df8,"body%d",uVar16 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e745;
    pfVar12 = (fdb_kvs_handle *)strlen(auStack_2c58 + 0x100);
    doc_00._M_i = (__int_type_conflict)auStack_2c58;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e758;
    sVar6 = strlen((char *)doc_00._M_i);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e768;
    sVar8 = strlen(acStack_2df8);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e78d;
    fdb_doc_create(apfStack_2cf8 + uVar16,auStack_2c58 + 0x100,(size_t)pfVar12,(void *)doc_00._M_i,
                   sVar6,acStack_2df8,sVar8);
    lVar17 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e79e;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e88 + lVar17 * 8 + 0x20),apfStack_2cf8[uVar16]);
      lVar17 = lVar17 + 1;
    } while (pcVar23 != (char *)lVar17);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x14);
  pfVar7 = (fdb_kvs_handle *)0x0;
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e7c2;
  fdb_commit(pfStack_2ea0,'\0');
  __s = logCallbackFunc;
  pcVar33 = "compact_upto_test";
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e7e0;
    fVar4 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_2e88 + (long)pfVar7 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eb2a;
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
  } while ((fdb_kvs_handle *)pcVar23 != pfVar7);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e804;
  fVar4 = fdb_get_all_snap_markers
                    (pfStack_2ea0,(fdb_snapshot_info_t **)&aStack_2ea8.seqtree,
                     (uint64_t *)&pfStack_2e98);
  pcVar34 = pcVar33;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_2e8c == '\0') {
      if (pfStack_2e98 != (fdb_kvs_handle *)0x4) {
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e92b;
        compact_upto_test();
      }
      pfVar7 = (fdb_kvs_handle *)0x1400000000;
      doc_00._M_i = 0;
      pfVar12 = (fdb_kvs_handle *)0xfffffffb00000000;
      pcVar23 = auStack_2e88 + 0x40;
      pcVar34 = (char *)0x0;
      aVar13 = aStack_2ea8;
      do {
        if (*(long *)((long)&(aVar13.seqtree)->root_bid + doc_00._M_i) != 1) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10e98d;
          compact_upto_test();
          aVar13 = aStack_2e48;
        }
        if (*(long *)(*(long *)((long)&(aVar13.seqtree)->blk_handle + doc_00._M_i) + 8) !=
            (long)pfVar7 >> 0x20) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10e9a2;
          compact_upto_test();
          aVar13 = aStack_2e48;
        }
        pcVar34 = (char *)((long)pcVar34 + 1);
        pfVar7 = (fdb_kvs_handle *)(pfVar7[-0x2762763].config.encryption_key.bytes + 0x14);
        doc_00._M_i = doc_00._M_i + 0x18;
      } while (pcVar34 < pfStack_2e98);
      __s = (code *)(auStack_2e88 + 0x40);
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e9c4;
      sprintf((char *)__s,"compact_test_compact%d",1);
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e9da;
      fVar4 = fdb_compact_upto(pfStack_2ea0,(char *)__s,
                               (fdb_snapshot_marker_t)(aStack_2ea8.seqtree)->blk_ops);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e9fe;
        fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2e88._32_8_,
                                  (fdb_kvs_handle **)(auStack_2e88 + 0x18),
                                  (fdb_seqnum_t)(aStack_2ea8.seqtrie)->btree_blk_ops->blk_alloc_sub)
        ;
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10ea07;
          compact_upto_test();
          goto LAB_0010ea07;
        }
LAB_0010ea64:
        __s = (code *)(auStack_2e88 + 0x40);
        pfStack_2ec0 = (fdb_kvs_handle *)0x10ea6e;
        fdb_kvs_close((fdb_kvs_handle *)auStack_2e88._24_8_);
        pfStack_2ec0 = (fdb_kvs_handle *)0x10ea7d;
        fVar4 = fdb_free_snap_markers
                          ((fdb_snapshot_info_t *)aStack_2ea8.seqtree,(uint64_t)pfStack_2e98);
        if (fVar4 == FDB_RESULT_SUCCESS) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10ea8f;
          fdb_close(pfStack_2ea0);
          lVar17 = 0;
          do {
            pfStack_2ec0 = (fdb_kvs_handle *)0x10ea9e;
            fdb_doc_free(apfStack_2cf8[lVar17]);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x14);
          pfStack_2ec0 = (fdb_kvs_handle *)0x10eaac;
          fdb_shutdown();
          pfStack_2ec0 = (fdb_kvs_handle *)0x10eab1;
          memleak_end();
          pcVar23 = "single kv mode:";
          if ((char)iStack_2e8c != '\0') {
            pcVar23 = "multiple kv mode:";
          }
          pfStack_2ec0 = (fdb_kvs_handle *)0x10eae1;
          sprintf(acStack_2df8,"compact upto marker in file test %s",pcVar23);
          pcVar23 = "%s PASSED\n";
          if (compact_upto_test(bool)::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_2ec0 = (fdb_kvs_handle *)0x10eb0e;
          iVar5 = fprintf(_stderr,pcVar23,acStack_2df8);
          return iVar5;
        }
        goto LAB_0010eb34;
      }
      goto LAB_0010eb39;
    }
    if (pfStack_2e98 != (fdb_kvs_handle *)0x8) {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e82c;
      compact_upto_test();
    }
    auStack_2e88._8_8_ = ZEXT48(uVar21 + 1);
    doc_00._M_i = (__int_type_conflict)auStack_2e88;
    pcVar34 = (char *)0x0;
    do {
      __s = (code *)((long)pcVar34 * 3);
      aVar13 = aStack_2ea8;
      if ((fdb_custom_cmp_variable)(&(aStack_2ea8.seqtree)->root_bid)[(long)pcVar34 * 3] !=
          (fdb_custom_cmp_variable)auStack_2e88._8_8_) {
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e911;
        compact_upto_test();
        aVar13 = aStack_2e48;
      }
      pfVar12 = (fdb_kvs_handle *)((long)pcVar34 * -5 + 0x14);
      pfVar15 = (fdb_kvs_commit_marker_t *)(&(aVar13.seqtree)->blk_handle)[(long)pcVar34 * 3];
      pfVar7 = (fdb_kvs_handle *)0x8;
      pcVar33 = (char *)0x0;
      auStack_2e88._16_8_ = pcVar34;
      do {
        if (*(fdb_kvs_handle **)(&(pfVar7->kvs_config).create_if_missing + (long)pfVar15) != pfVar12
           ) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10e8e2;
          compact_upto_test();
        }
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e892;
        sprintf((char *)doc_00._M_i,"kv%d",(ulong)pcVar33 & 0xffffffff);
        pfVar15 = (fdb_kvs_commit_marker_t *)(&(aStack_2ea8.seqtree)->blk_handle)[(long)pcVar34 * 3]
        ;
        psVar2 = *(short **)((long)&pfVar15[-1].seqnum + (long)pfVar7);
        if ((char)psVar2[1] != auStack_2e88[2] || *psVar2 != auStack_2e88._0_2_) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10eb2a;
          compact_upto_test();
          goto LAB_0010eb2a;
        }
        pcVar33 = pcVar33 + 1;
        pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).custom_cmp_param;
      } while (pcVar23 != pcVar33);
      pcVar34 = (char *)(auStack_2e88._16_8_ + 1);
    } while (pcVar34 != pcVar23);
LAB_0010ea07:
    __s = (code *)(auStack_2e88 + 0x40);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10ea22;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10ea38;
    fVar4 = fdb_compact_upto(pfStack_2ea0,(char *)__s,
                             (fdb_snapshot_marker_t)(aStack_2ea8.seqtree)->blk_ops);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eb3e;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10ea5c;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2e88._40_8_,
                              (fdb_kvs_handle **)(auStack_2e88 + 0x18),
                              (fdb_seqnum_t)(aStack_2ea8.seqtrie)->btree_blk_ops->blk_read);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0010ea64;
  }
  else {
LAB_0010eb2f:
    pfStack_2ec0 = (fdb_kvs_handle *)0x10eb34;
    compact_upto_test();
LAB_0010eb34:
    pfStack_2ec0 = (fdb_kvs_handle *)0x10eb39;
    compact_upto_test();
LAB_0010eb39:
    pfStack_2ec0 = (fdb_kvs_handle *)0x10eb3e;
    compact_upto_test();
LAB_0010eb3e:
    pfStack_2ec0 = (fdb_kvs_handle *)0x10eb43;
    compact_upto_test();
  }
  pfStack_2ec0 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_33a8 = (fdb_kvs_handle *)0x10eb65;
  pcStack_2ee8 = __s;
  pfStack_2ee0 = pfVar7;
  pfStack_2ed8 = (fdb_kvs_handle *)doc_00._M_i;
  pcStack_2ed0 = pcVar23;
  pcStack_2ec8 = pcVar34;
  pfStack_2ec0 = pfVar12;
  gettimeofday((timeval *)(auStack_3358 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_33a8 = (fdb_kvs_handle *)0x10eb6a;
  memleak_start();
  pfStack_33a8 = (fdb_kvs_handle *)0x10eb76;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_33a8 = (fdb_kvs_handle *)0x10eb86;
  fdb_get_default_config();
  pfVar14 = (fdb_kvs_handle *)auStack_3358;
  pfStack_33a8 = (fdb_kvs_handle *)0x10eb93;
  fdb_get_default_kvs_config();
  fStack_32e8.buffercache_size = 0x1000000;
  fStack_32e8.wal_threshold = 0x400;
  fStack_32e8.flags = 1;
  fStack_32e8.compaction_threshold = '\0';
  pbVar31 = (btree *)&pfStack_3388;
  pfStack_33a8 = (fdb_kvs_handle *)0x10ebc5;
  fdb_open((fdb_file_handle **)pbVar31,"./compact_test1",&fStack_32e8);
  ppfVar19 = &pfStack_3398;
  pfStack_33a8 = (fdb_kvs_handle *)0x10ebd8;
  fdb_kvs_open_default(pfStack_3388,ppfVar19,(fdb_kvs_config *)pfVar14);
  pfStack_33a8 = (fdb_kvs_handle *)0x10ebee;
  fVar4 = fdb_set_log_callback(pfStack_3398,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_33a8 = (fdb_kvs_handle *)0x10ec12;
    fdb_open((fdb_file_handle **)auStack_3378,"./compact_test1",&fStack_32e8);
    ppfVar19 = &pfStack_3380;
    pfStack_33a8 = (fdb_kvs_handle *)0x10ec27;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3378._0_8_,ppfVar19,(fdb_kvs_config *)auStack_3358);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ec3d;
    fVar4 = fdb_set_log_callback(pfStack_3380,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f07d;
    pfStack_33a8 = (fdb_kvs_handle *)0x10ec60;
    sprintf(acStack_2ff0,"key%d",0);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ec7b;
    sprintf(acStack_30f0,"meta%d",0);
    pbVar31 = abStack_31f0;
    pfStack_33a8 = (fdb_kvs_handle *)0x10ec96;
    sprintf((char *)pbVar31,"body%d",0);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ec9e;
    sVar6 = strlen(acStack_2ff0);
    pfStack_33a8 = (fdb_kvs_handle *)0x10eca9;
    sVar8 = strlen(acStack_30f0);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ecb4;
    sVar9 = strlen((char *)pbVar31);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ecd4;
    fdb_doc_create((fdb_doc **)(auStack_3378 + 8),acStack_2ff0,sVar6,acStack_30f0,sVar8,pbVar31,
                   sVar9);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ece2;
    fdb_set(pfStack_3398,(fdb_doc *)auStack_3378._8_8_);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ecf8;
    sprintf(acStack_2ff0,"key%d",1);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ed0e;
    sprintf(acStack_30f0,"meta%d",1);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ed24;
    sprintf((char *)pbVar31,"body%d",1);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ed2c;
    sVar6 = strlen(acStack_2ff0);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ed37;
    sVar8 = strlen(acStack_30f0);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ed42;
    sVar9 = strlen((char *)pbVar31);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ed5f;
    fdb_doc_create((fdb_doc **)(auStack_3378 + 0x10),acStack_2ff0,sVar6,acStack_30f0,sVar8,pbVar31,
                   sVar9);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ed6e;
    fdb_set(pfStack_3398,(fdb_doc *)auStack_3378._16_8_);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ed9a;
    fdb_doc_create((fdb_doc **)&pfStack_3390,
                   *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                    (auStack_3378._16_8_ + 0x20),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_3378._16_8_,
                   *(btree_print_func **)(auStack_3378._16_8_ + 0x38),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                            (auStack_3378._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_3390->file = true;
    pfStack_33a8 = (fdb_kvs_handle *)0x10edac;
    fdb_set(pfStack_3398,(fdb_doc *)pfStack_3390);
    pfStack_33a8 = (fdb_kvs_handle *)0x10edb5;
    fdb_doc_free((fdb_doc *)pfStack_3390);
    pfStack_33a8 = (fdb_kvs_handle *)0x10edc4;
    fdb_commit(pfStack_3388,'\x01');
    pfStack_33a8 = (fdb_kvs_handle *)0x10edd5;
    fdb_compact(pfStack_3388,"./compact_test2");
    pfStack_33a8 = (fdb_kvs_handle *)0x10ede1;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_33a8 = (fdb_kvs_handle *)0x10edf7;
    sprintf(acStack_2ff0,"key%d",2);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee0d;
    sprintf(acStack_30f0,"meta%d",2);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee23;
    sprintf((char *)pbVar31,"body%d",2);
    pfVar7 = (fdb_kvs_handle *)(auStack_3378 + 0x18);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee30;
    doc_00._M_i = strlen(acStack_2ff0);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee3b;
    pfVar12 = (fdb_kvs_handle *)strlen(acStack_30f0);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee46;
    sVar6 = strlen((char *)pbVar31);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee61;
    fdb_doc_create((fdb_doc **)pfVar7,acStack_2ff0,doc_00._M_i,acStack_30f0,(size_t)pfVar12,pbVar31,
                   sVar6);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee6f;
    fdb_set(pfStack_3398,(fdb_doc *)auStack_3378._24_8_);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee7e;
    fdb_commit(pfStack_3388,'\x01');
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee88;
    fdb_kvs_close(pfStack_3398);
    ppfVar19 = &pfStack_3380;
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee95;
    fdb_kvs_close(pfStack_3380);
    pfStack_33a8 = (fdb_kvs_handle *)0x10ee9f;
    fdb_close(pfStack_3388);
    pfVar14 = (fdb_kvs_handle *)auStack_3378;
    pfStack_33a8 = (fdb_kvs_handle *)0x10eeac;
    fdb_close((fdb_file_handle *)auStack_3378._0_8_);
    pfStack_33a8 = (fdb_kvs_handle *)0x10eeb8;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_33a8 = (fdb_kvs_handle *)0x10eecf;
    fdb_open((fdb_file_handle **)pfVar14,"./compact_test1",&fStack_32e8);
    pfStack_33a8 = (fdb_kvs_handle *)0x10eedf;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3378._0_8_,ppfVar19,(fdb_kvs_config *)auStack_3358);
    pfStack_33a8 = (fdb_kvs_handle *)0x10eef5;
    fVar4 = fdb_set_log_callback(pfStack_3380,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      doc_00._M_i = 0;
      ppfVar19 = &pfStack_3390;
      while( true ) {
        pfStack_33a8 = (fdb_kvs_handle *)0x10ef29;
        fdb_doc_create((fdb_doc **)ppfVar19,
                       (void *)(*(size_t **)(auStack_3378 + doc_00._M_i * 8 + 8))[4],
                       **(size_t **)(auStack_3378 + doc_00._M_i * 8 + 8),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_33a8 = (fdb_kvs_handle *)0x10ef38;
        fVar4 = fdb_get(pfStack_3380,(fdb_doc *)pfStack_3390);
        pfVar27 = pfStack_3390;
        if ((fdb_kvs_handle *)doc_00._M_i != (fdb_kvs_handle *)0x1) break;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010f073;
LAB_0010ef9e:
        pfStack_33a8 = (fdb_kvs_handle *)0x10efa6;
        fdb_doc_free((fdb_doc *)pfVar27);
        doc_00._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)doc_00._M_i)->kvs_config).field_0x1;
        pfVar14 = pfVar27;
        if ((undefined1 *)doc_00._M_i == (undefined1 *)0x3) {
          pfStack_33a8 = (fdb_kvs_handle *)0x10efc5;
          fdb_get_file_info((fdb_file_handle *)auStack_3378._0_8_,&fStack_3330);
          pfStack_33a8 = (fdb_kvs_handle *)0x10efd4;
          iVar5 = strcmp("./compact_test2",fStack_3330.filename);
          if (iVar5 != 0) {
            pfStack_33a8 = (fdb_kvs_handle *)0x10efe2;
            auto_recover_compact_ok_test();
          }
          pfStack_33a8 = (fdb_kvs_handle *)0x10efec;
          fdb_kvs_close(pfStack_3380);
          pfStack_33a8 = (fdb_kvs_handle *)0x10eff6;
          fdb_close((fdb_file_handle *)auStack_3378._0_8_);
          lVar17 = 0;
          do {
            pfStack_33a8 = (fdb_kvs_handle *)0x10f002;
            fdb_doc_free(*(fdb_doc **)(auStack_3378 + lVar17 * 8 + 8));
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          pfStack_33a8 = (fdb_kvs_handle *)0x10f010;
          fdb_shutdown();
          pfStack_33a8 = (fdb_kvs_handle *)0x10f015;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_33a8 = (fdb_kvs_handle *)0x10f046;
          iVar5 = fprintf(_stderr,pcVar23,"auto recovery after compaction test");
          return iVar5;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar31 = pfStack_3390->staletree;
        pfVar12 = *(fdb_kvs_handle **)(auStack_3378 + doc_00._M_i * 8 + 8);
        pfVar7 = (fdb_kvs_handle *)pfVar12->staletree;
        pfStack_33a8 = (fdb_kvs_handle *)0x10ef77;
        iVar5 = bcmp(pbVar31,pfVar7,(size_t)(pfStack_3390->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar31 = (pfVar27->field_6).seqtree;
          pfVar7 = (fdb_kvs_handle *)(pfVar12->field_6).seqtree;
          pfStack_33a8 = (fdb_kvs_handle *)0x10ef96;
          iVar5 = bcmp(pbVar31,pfVar7,(size_t)(pfVar27->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010ef9e;
          pfStack_33a8 = (fdb_kvs_handle *)0x10f063;
          auto_recover_compact_ok_test();
          pfVar14 = pfVar27;
          goto LAB_0010f063;
        }
      }
      else {
LAB_0010f063:
        pfVar27 = pfVar14;
        pfStack_33a8 = (fdb_kvs_handle *)0x10f068;
        auto_recover_compact_ok_test();
      }
      pfStack_33a8 = (fdb_kvs_handle *)0x10f073;
      auto_recover_compact_ok_test();
      pfVar14 = pfVar27;
LAB_0010f073:
      pfStack_33a8 = (fdb_kvs_handle *)0x10f078;
      auto_recover_compact_ok_test();
      goto LAB_0010f078;
    }
  }
  else {
LAB_0010f078:
    pfStack_33a8 = (fdb_kvs_handle *)0x10f07d;
    auto_recover_compact_ok_test();
LAB_0010f07d:
    pfStack_33a8 = (fdb_kvs_handle *)0x10f082;
    auto_recover_compact_ok_test();
  }
  pfStack_33a8 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_3910 = (fdb_kvs_handle *)0x10f0a7;
  ppfStack_33d0 = ppfVar19;
  pfStack_33c8 = pfVar7;
  pfStack_33c0 = (fdb_kvs_handle *)doc_00._M_i;
  pfStack_33b8 = pfVar14;
  pbStack_33b0 = pbVar31;
  pfStack_33a8 = pfVar12;
  gettimeofday(&tStack_3880,(__timezone_ptr_t)0x0);
  pfStack_3910 = (fdb_kvs_handle *)0x10f0ac;
  memleak_start();
  pfStack_3910 = (fdb_kvs_handle *)0x10f0b8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3910 = (fdb_kvs_handle *)0x10f0c8;
  fdb_get_default_config();
  pfVar14 = (fdb_kvs_handle *)auStack_3870;
  pfStack_3910 = (fdb_kvs_handle *)0x10f0d8;
  fdb_get_default_kvs_config();
  fStack_34c8.buffercache_size = 0x1000000;
  fStack_34c8.wal_threshold = 0x400;
  fStack_34c8.flags = 1;
  fStack_34c8.compaction_threshold = '\0';
  ppfVar35 = &pfStack_38e8;
  pfStack_3910 = (fdb_kvs_handle *)0x10f10a;
  fdb_open((fdb_file_handle **)ppfVar35,"./compact_test1",&fStack_34c8);
  ptr_handle = (list *)(auStack_38f8 + 8);
  pfStack_3910 = (fdb_kvs_handle *)0x10f11d;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_38e8,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar14
            );
  pfStack_3910 = (fdb_kvs_handle *)0x10f133;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_38f8._8_8_,logCallbackFunc,
                     "unlink_after_compaction_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar7 = (fdb_kvs_handle *)0x0;
    uVar16 = 0;
    do {
      pfStack_3910 = (fdb_kvs_handle *)0x10f15b;
      sprintf(acStack_3658,"key%d",uVar16 & 0xffffffff);
      pfStack_3910 = (fdb_kvs_handle *)0x10f173;
      sprintf(auStack_3870 + 0x118,"meta%d",uVar16 & 0xffffffff);
      pfStack_3910 = (fdb_kvs_handle *)0x10f18b;
      sprintf(auStack_3870 + 0x18,"body%d",uVar16 & 0xffffffff);
      ppfVar35 = (fdb_doc **)((long)apfStack_38d8 + (long)pfVar7);
      pfStack_3910 = (fdb_kvs_handle *)0x10f19b;
      doc_00._M_i = strlen(acStack_3658);
      pfVar12 = (fdb_kvs_handle *)(auStack_3870 + 0x118);
      pfStack_3910 = (fdb_kvs_handle *)0x10f1ae;
      pfVar14 = (fdb_kvs_handle *)strlen((char *)pfVar12);
      pfStack_3910 = (fdb_kvs_handle *)0x10f1be;
      sVar6 = strlen(auStack_3870 + 0x18);
      pfStack_3910 = (fdb_kvs_handle *)0x10f1e3;
      fdb_doc_create(ppfVar35,acStack_3658,doc_00._M_i,pfVar12,(size_t)pfVar14,auStack_3870 + 0x18,
                     sVar6);
      pfStack_3910 = (fdb_kvs_handle *)0x10f1f2;
      fdb_set((fdb_kvs_handle *)auStack_38f8._8_8_,apfStack_38d8[uVar16]);
      uVar16 = uVar16 + 1;
      pfVar7 = (fdb_kvs_handle *)((long)pfVar7 + 8);
    } while (uVar16 != 10);
    pfStack_3910 = (fdb_kvs_handle *)0x10f212;
    fdb_commit((fdb_file_handle *)pfStack_38e8,'\x01');
    pfStack_3910 = (fdb_kvs_handle *)0x10f226;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_38f8._8_8_,&pfStack_38e0,10);
    ptr_handle = (list *)0xa;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f38b;
    pfStack_3910 = (fdb_kvs_handle *)0x10f23f;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_38e8,"./compact_test2");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfVar14 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_3910 = (fdb_kvs_handle *)0x10f273;
        fdb_doc_create((fdb_doc **)auStack_38f8,apfStack_38d8[(long)pfVar14]->key,
                       apfStack_38d8[(long)pfVar14]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_3910 = (fdb_kvs_handle *)0x10f282;
        fVar4 = fdb_get((fdb_kvs_handle *)auStack_38f8._8_8_,(fdb_doc *)auStack_38f8._0_8_);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_3910 = (fdb_kvs_handle *)0x10f381;
          unlink_after_compaction_test();
          goto LAB_0010f381;
        }
        pfStack_3910 = (fdb_kvs_handle *)0x10f294;
        fdb_doc_free((fdb_doc *)auStack_38f8._0_8_);
        pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
      } while (pfVar14 != (fdb_kvs_handle *)0xa);
      pfStack_3910 = (fdb_kvs_handle *)0x10f2b1;
      iVar5 = stat("./compact_test1",&sStack_3558);
      if (iVar5 == 0) {
        pfStack_3910 = (fdb_kvs_handle *)0x10f2ba;
        unlink_after_compaction_test();
      }
      pfVar14 = (fdb_kvs_handle *)0x0;
      while( true ) {
        pfStack_3910 = (fdb_kvs_handle *)0x10f2e6;
        fdb_doc_create((fdb_doc **)auStack_38f8,apfStack_38d8[(long)pfVar14]->key,
                       apfStack_38d8[(long)pfVar14]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_3910 = (fdb_kvs_handle *)0x10f2f5;
        fVar4 = fdb_get(pfStack_38e0,(fdb_doc *)auStack_38f8._0_8_);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfStack_3910 = (fdb_kvs_handle *)0x10f307;
        fdb_doc_free((fdb_doc *)auStack_38f8._0_8_);
        pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
        if (pfVar14 == (fdb_kvs_handle *)0xa) {
          pfStack_3910 = (fdb_kvs_handle *)0x10f31a;
          fdb_close((fdb_file_handle *)pfStack_38e8);
          pfStack_3910 = (fdb_kvs_handle *)0x10f31f;
          fdb_shutdown();
          lVar17 = 0;
          do {
            pfStack_3910 = (fdb_kvs_handle *)0x10f32b;
            fdb_doc_free(apfStack_38d8[lVar17]);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 10);
          pfStack_3910 = (fdb_kvs_handle *)0x10f339;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_3910 = (fdb_kvs_handle *)0x10f36a;
          iVar5 = fprintf(_stderr,pcVar23,"unlink after compaction test");
          return iVar5;
        }
      }
LAB_0010f381:
      ptr_handle = (list *)auStack_38f8;
      pfStack_3910 = (fdb_kvs_handle *)0x10f386;
      unlink_after_compaction_test();
      goto LAB_0010f386;
    }
  }
  else {
LAB_0010f386:
    pfStack_3910 = (fdb_kvs_handle *)0x10f38b;
    unlink_after_compaction_test();
LAB_0010f38b:
    pfStack_3910 = (fdb_kvs_handle *)0x10f390;
    unlink_after_compaction_test();
  }
  pfStack_3910 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_40b8 = (fdb_kvs_handle *)0x10f3b5;
  fStack_3b20.bub_ctx.entries = ptr_handle;
  fStack_3b20.bub_ctx.num_entries = (uint64_t)pfVar7;
  fStack_3b20.bub_ctx.space_used = doc_00._M_i;
  fStack_3b20.bub_ctx.handle = pfVar14;
  ppfStack_3918 = ppfVar35;
  pfStack_3910 = pfVar12;
  gettimeofday(&tStack_4020,(__timezone_ptr_t)0x0);
  pfStack_40b8 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_40b8 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_40b8 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config = &fStack_4068;
  pfStack_40b8 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  auStack_3f10._256_8_ = 0x1000000;
  auStack_3f10._264_8_ = 0x400;
  auStack_3f10._284_4_ = 1;
  auStack_3f10[0x127] = 0;
  pfVar14 = (fdb_kvs_handle *)(auStack_4090 + 0x18);
  pfStack_40b8 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar14,"./compact_test1",(fdb_config *)(auStack_3f10 + 0xf8));
  ppfVar19 = (fdb_kvs_handle **)(auStack_4090 + 8);
  pfStack_40b8 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)auStack_4090._24_8_,ppfVar19,(char *)0x0,kvs_config);
  pfStack_40b8 = (fdb_kvs_handle *)0x10f440;
  pfVar27 = (fdb_kvs_handle *)auStack_4090._8_8_;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_4090._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar7 = (fdb_kvs_handle *)0x0;
    uVar16 = 0;
    do {
      pfStack_40b8 = (fdb_kvs_handle *)0x10f468;
      sprintf(acStack_3c20,"key%d",uVar16 & 0xffffffff);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f480;
      sprintf(auStack_3f10 + 0x1f0,"meta%d",uVar16 & 0xffffffff);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f498;
      sprintf(acStack_4010,"body%d",uVar16 & 0xffffffff);
      pfVar14 = (fdb_kvs_handle *)(auStack_3f10 + (long)pfVar7);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f4ab;
      doc_00._M_i = strlen(acStack_3c20);
      pfVar12 = (fdb_kvs_handle *)(auStack_3f10 + 0x1f0);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f4be;
      kvs_config = (fdb_kvs_config *)strlen((char *)pfVar12);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f4ce;
      sVar6 = strlen(acStack_4010);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar14,acStack_3c20,doc_00._M_i,pfVar12,(size_t)kvs_config,
                     acStack_4010,sVar6);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)auStack_4090._8_8_,*(fdb_doc **)(auStack_3f10 + uVar16 * 8));
      uVar16 = uVar16 + 1;
      pfVar7 = (fdb_kvs_handle *)((long)pfVar7 + 8);
    } while (uVar16 != 0x1e);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)auStack_4090._24_8_,'\0');
    pfStack_40b8 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(auStack_4090 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_3f10 + 0xf8));
    ppfVar19 = (fdb_kvs_handle **)auStack_40a0;
    pfStack_40b8 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)auStack_4090._16_8_,ppfVar19,(char *)0x0,&fStack_4068);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f56b;
    pfVar27 = (fdb_kvs_handle *)auStack_40a0._0_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_40a0._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    pfVar7 = (fdb_kvs_handle *)0x0;
    uVar16 = 0;
    do {
      pfStack_40b8 = (fdb_kvs_handle *)0x10f593;
      sprintf(acStack_3c20,"k2ey%d",uVar16 & 0xffffffff);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(auStack_3f10 + 0x1f0,"m2eta%d",uVar16 & 0xffffffff);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(acStack_4010,"b2ody%d",uVar16 & 0xffffffff);
      pfVar14 = (fdb_kvs_handle *)(&fStack_3b20.kvs_config.create_if_missing + (long)pfVar7);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f5d6;
      doc_00._M_i = strlen(acStack_3c20);
      pfVar12 = (fdb_kvs_handle *)(auStack_3f10 + 0x1f0);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config = (fdb_kvs_config *)strlen((char *)pfVar12);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f5f9;
      sVar6 = strlen(acStack_4010);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar14,acStack_3c20,doc_00._M_i,pfVar12,(size_t)kvs_config,
                     acStack_4010,sVar6);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)auStack_40a0._0_8_,
              *(fdb_doc **)(&fStack_3b20.kvs_config.create_if_missing + uVar16 * 8));
      uVar16 = uVar16 + 1;
      pfVar7 = (fdb_kvs_handle *)((long)pfVar7 + 8);
    } while (uVar16 != 0x3c);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)auStack_4090._16_8_,'\0');
    pfStack_40b8 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_40a0._0_8_,&fStack_4050);
    if ((filemgr *)fStack_4050.last_seqnum != (filemgr *)0x3c) {
      pfStack_40b8 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_40b8 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)auStack_40a0._0_8_);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)auStack_4090._16_8_);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f68c;
    pfVar27 = (fdb_kvs_handle *)auStack_4090._24_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_4090._24_8_,(char *)0x0);
    ppfVar19 = (fdb_kvs_handle **)0x3c;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config = (fdb_kvs_config *)(auStack_4090 + 8);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4090._8_8_);
    pfVar14 = (fdb_kvs_handle *)(auStack_4090 + 0x18);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)auStack_4090._24_8_);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar14,"./compact_test1",(fdb_config *)(auStack_3f10 + 0xf8));
    pfStack_40b8 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)auStack_4090._24_8_,(fdb_kvs_handle **)kvs_config,(char *)0x0,
                 &fStack_4068);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f6ed;
    pfVar27 = (fdb_kvs_handle *)auStack_4090._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4090._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ppfVar19 = (fdb_kvs_handle **)0x0;
    kvs_config = (fdb_kvs_config *)(auStack_40a0 + 8);
    pfVar14 = (fdb_kvs_handle *)auStack_4090;
    do {
      pfStack_40b8 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config,(void *)(*(size_t **)(auStack_3f10 + (long)ppfVar19))[4]
                     ,**(size_t **)(auStack_3f10 + (long)ppfVar19),(void *)0x0,0,(void *)0x0,0);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f737;
      pfVar27 = (fdb_kvs_handle *)auStack_4090._8_8_;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_4090._8_8_,(fdb_doc *)auStack_40a0._8_8_);
      pfVar22 = (fdb_kvs_handle *)auStack_40a0._8_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_40b8 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      doc_00._M_i = (__int_type_conflict)(auStack_3f10 + (long)ppfVar19);
      pfVar7 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)doc_00._M_i)->kvs_config;
      pfStack_40b8 = (fdb_kvs_handle *)0x10f765;
      iVar5 = bcmp(*(btree **)(auStack_40a0._8_8_ + 0x38),pfVar7->staletree,
                   (size_t)((fdb_kvs_config *)auStack_40a0._8_8_)->custom_cmp);
      if (iVar5 != 0) {
        pfStack_40b8 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar22 = pfStack_4070;
        pfVar7 = (fdb_kvs_handle *)auStack_4090._0_8_;
      }
      pfStack_40b8 = (fdb_kvs_handle *)0x10f77b;
      iVar5 = bcmp((pfVar22->field_6).seqtree,(pfVar7->field_6).seqtree,
                   (size_t)(pfVar22->kvs_config).custom_cmp_param);
      pfVar12 = pfVar22;
      if (iVar5 != 0) {
        pfStack_40b8 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        pfVar12 = (fdb_kvs_handle *)auStack_4090._0_8_;
      }
      pfStack_40b8 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)pfVar12);
      ppfVar19 = ppfVar19 + 1;
    } while (ppfVar19 != (fdb_kvs_handle **)0xf0);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(auStack_4090 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_3f10 + 0xf8));
    kvs_config = (fdb_kvs_config *)auStack_40a0;
    pfStack_40b8 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)auStack_4090._16_8_,(fdb_kvs_handle **)kvs_config,(char *)0x0,
                 &fStack_4068);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f817;
    pfVar27 = (fdb_kvs_handle *)auStack_40a0._0_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_40a0._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_40b8 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_40a0._0_8_,&fStack_4050);
      if ((filemgr *)fStack_4050.last_seqnum != (filemgr *)0x3c) {
        pfStack_40b8 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      pfVar12 = (fdb_kvs_handle *)0x0;
      ppfVar19 = (fdb_kvs_handle **)(auStack_40a0 + 8);
      kvs_config = (fdb_kvs_config *)auStack_4090;
      while( true ) {
        psVar3 = *(size_t **)
                  (&fStack_3b20.kvs_config.create_if_missing +
                  (long)&(pfVar12->kvs_config).create_if_missing);
        pfStack_40b8 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ppfVar19,(void *)psVar3[4],*psVar3,(void *)0x0,0,(void *)0x0,0);
        pfStack_40b8 = (fdb_kvs_handle *)0x10f884;
        pfVar27 = (fdb_kvs_handle *)auStack_40a0._0_8_;
        fVar4 = fdb_get((fdb_kvs_handle *)auStack_40a0._0_8_,(fdb_doc *)auStack_40a0._8_8_);
        pfVar22 = (fdb_kvs_handle *)auStack_40a0._8_8_;
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfVar7 = (fdb_kvs_handle *)
                 (&fStack_3b20.kvs_config.create_if_missing +
                 (long)&(pfVar12->kvs_config).create_if_missing);
        pfVar14 = *(fdb_kvs_handle **)&pfVar7->kvs_config;
        pfStack_40b8 = (fdb_kvs_handle *)0x10f8b1;
        iVar5 = bcmp(*(btree **)(auStack_40a0._8_8_ + 0x38),pfVar14->staletree,
                     (size_t)((fdb_kvs_config *)auStack_40a0._8_8_)->custom_cmp);
        if (iVar5 != 0) {
          pfStack_40b8 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar22 = pfStack_4070;
          pfVar14 = (fdb_kvs_handle *)auStack_4090._0_8_;
        }
        pfStack_40b8 = (fdb_kvs_handle *)0x10f8c6;
        iVar5 = bcmp((pfVar22->field_6).seqtree,(pfVar14->field_6).seqtree,
                     (size_t)(pfVar22->kvs_config).custom_cmp_param);
        doc_00._M_i = (__int_type_conflict)pfVar22;
        if (iVar5 != 0) {
          pfStack_40b8 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          doc_00._M_i = auStack_4090._0_8_;
        }
        pfStack_40b8 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)doc_00._M_i);
        pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).custom_cmp;
        if (pfVar12 == (fdb_kvs_handle *)0x1e0) {
          lVar17 = 0;
          do {
            pfStack_40b8 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(auStack_3f10 + lVar17 * 8));
            pfStack_40b8 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&fStack_3b20.kvs_config.create_if_missing + lVar17 * 8));
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x1e);
          lVar17 = 0;
          do {
            pfStack_40b8 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(fStack_3b20.config.encryption_key.bytes + lVar17 * 8 + -0x14)
                        );
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x1e);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4090._8_8_);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)auStack_4090._24_8_);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)auStack_40a0._0_8_);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)auStack_4090._16_8_);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_40b8 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_40b8 = (fdb_kvs_handle *)0x10f9b9;
          iVar5 = fprintf(_stderr,pcVar23,"compact overwrite");
          return iVar5;
        }
      }
LAB_0010f9d0:
      pfStack_40b8 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_40b8 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_40b8 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_40b8 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_40b8 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_40b8 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_40e0 = ppfVar19;
  pfStack_40d8 = pfVar7;
  pfStack_40d0 = (fdb_kvs_handle *)doc_00._M_i;
  pfStack_40c8 = kvs_config;
  pfStack_40c0 = pfVar14;
  pfStack_40b8 = pfVar12;
  gettimeofday(&tStack_4810,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_4800.buffercache_size = 0;
  fStack_4800.wal_threshold = 0x400;
  fStack_4800.compaction_threshold = '\0';
  if (pfVar27 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var28._M_i = (__int_type_conflict)&pfStack_4878;
    fVar4 = fdb_open((fdb_file_handle **)_Var28._M_i,"./compact_test1",&fStack_4800);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      _Var28._M_i = (__int_type_conflict)pfStack_4878;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4878,&pfStack_4870,&fStack_4858);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar17 = 0;
      uVar16 = 0;
      do {
        pfVar1 = &afStack_4608[0].config.encryption_key;
        sprintf((char *)pfVar1,"key%d",uVar16 & 0xffffffff);
        sprintf((char *)afStack_4608,"meta%d",uVar16 & 0xffffffff);
        sprintf(acStack_4708,"body%d",uVar16 & 0xffffffff);
        doc_00._M_i = strlen((char *)pfVar1);
        pfVar12 = afStack_4608;
        sVar6 = strlen((char *)pfVar12);
        sVar8 = strlen(acStack_4708);
        fdb_doc_create((fdb_doc **)((long)&afStack_4608[0].bub_ctx.handle + lVar17),
                       &afStack_4608[0].config.encryption_key,doc_00._M_i,pfVar12,sVar6,acStack_4708
                       ,sVar8);
        fdb_set(pfStack_4870,(fdb_doc *)(&afStack_4608[0].bub_ctx.handle)[uVar16]);
        uVar16 = uVar16 + 1;
        lVar17 = lVar17 + 8;
      } while (uVar16 != 100);
      fdb_commit((fdb_file_handle *)pfStack_4878,'\0');
      fdb_get_kvs_info(pfStack_4870,&fStack_4840);
      if ((filemgr *)fStack_4840.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar17 = 0;
      pfVar14 = (fdb_kvs_handle *)&plStack_4868;
      do {
        fdb_del(pfStack_4870,(fdb_doc *)(&afStack_4608[0].bub_ctx.handle)[lVar17]);
        if (lVar17 == 0x32) {
          pthread_create((pthread_t *)pfVar14,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_4878);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 100);
      pthread_join((pthread_t)plStack_4868,&pvStack_4860);
      fdb_commit((fdb_file_handle *)pfStack_4878,'\x01');
      fdb_get_kvs_info(pfStack_4870,&fStack_4840);
      if ((filemgr *)fStack_4840.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_4870);
      _Var28._M_i = (__int_type_conflict)&pfStack_4878;
      fdb_close((fdb_file_handle *)pfStack_4878);
      fVar4 = fdb_open((fdb_file_handle **)_Var28._M_i,"./compact_test1",&fStack_4800);
      pfVar7 = (fdb_kvs_handle *)0x64;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var28._M_i = (__int_type_conflict)pfStack_4878;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4878,&pfStack_4870,&fStack_4858);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_4870,&fStack_4840);
        if ((filemgr *)fStack_4840.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar17 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_4608[0].bub_ctx.handle)[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 100);
        fdb_kvs_close(pfStack_4870);
        fdb_close((fdb_file_handle *)pfStack_4878);
        fdb_shutdown();
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar23,"multi thread client shutdown");
        return 0;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var28._M_i = (__int_type_conflict)&pfStack_4878;
    fVar4 = fdb_open((fdb_file_handle **)_Var28._M_i,"./compact_test1",&fStack_4800);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var28._M_i = (__int_type_conflict)pfStack_4878;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_4878,(char *)0x0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_4878);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle = (filemgr *)0x0;
  pfStack_18638 = (fdb_kvs_handle *)0x10fd83;
  auStack_18600._8_8_ = _Var28._M_i;
  gettimeofday(&tStack_18498,(__timezone_ptr_t)0x0);
  pfStack_18638 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_18638 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar23 = auStack_185a0;
  pfStack_18638 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_18638 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_185a0._8_8_ = 0;
  aStack_18590.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_1857c = 1;
  uStack_18572 = 0x1e01;
  pfStack_18568 = (filemgr *)0x1;
  aStack_18528.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  pcVar33 = auStack_18628;
  pfStack_18638 = (fdb_kvs_handle *)0x10fde7;
  fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test",(fdb_config *)pcVar23);
  if (fVar4 == FDB_RESULT_INVALID_CONFIG) {
    aStack_18528.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
    pfStack_18638 = (fdb_kvs_handle *)0x10fe14;
    fdb_open((fdb_file_handle **)auStack_18628,"compact_test",(fdb_config *)auStack_185a0);
    pcVar23 = auStack_18620;
    pfStack_18638 = (fdb_kvs_handle *)0x10fe29;
    fdb_kvs_open_default((fdb_file_handle *)auStack_18628,(fdb_kvs_handle **)pcVar23,&fStack_185f0);
    pfStack_18638 = (fdb_kvs_handle *)0x10fe3f;
    pcVar33 = (char *)auStack_18620;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18620,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
    pfStack_18638 = (fdb_kvs_handle *)0x10fe53;
    puts("Initialize..");
    doc_00._M_i = 0;
    uVar16 = 0;
    do {
      pfStack_18638 = (fdb_kvs_handle *)0x10fe75;
      sprintf(auStack_18488 + 0x48,"key%04d",uVar16 & 0xffffffff);
      pfStack_18638 = (fdb_kvs_handle *)0x10fe8e;
      sprintf(acStack_18240,"meta%04d",uVar16 & 0xffffffff);
      pfStack_18638 = (fdb_kvs_handle *)0x10fea7;
      sprintf(acStack_18340,"body%04d",uVar16 & 0xffffffff);
      pfVar7 = (fdb_kvs_handle *)(&afStack_18140[0].kvs_config.create_if_missing + doc_00._M_i);
      pfStack_18638 = (fdb_kvs_handle *)0x10feba;
      sVar6 = strlen(auStack_18488 + 0x48);
      pfVar12 = (fdb_kvs_handle *)(sVar6 + 1);
      pfStack_18638 = (fdb_kvs_handle *)0x10fece;
      sVar6 = strlen(acStack_18240);
      pfVar14 = (fdb_kvs_handle *)(sVar6 + 1);
      pfStack_18638 = (fdb_kvs_handle *)0x10fedf;
      sVar6 = strlen(acStack_18340);
      pfStack_18638 = (fdb_kvs_handle *)0x10ff07;
      fdb_doc_create((fdb_doc **)pfVar7,auStack_18488 + 0x48,(size_t)pfVar12,acStack_18240,
                     (size_t)pfVar14,acStack_18340,sVar6 + 1);
      pfStack_18638 = (fdb_kvs_handle *)0x10ff19;
      fdb_set((fdb_kvs_handle *)auStack_18620,
              *(fdb_doc **)(&afStack_18140[0].kvs_config.create_if_missing + uVar16 * 8));
      uVar16 = uVar16 + 1;
      doc_00._M_i = doc_00._M_i + 8;
    } while (uVar16 != 10000);
    pcVar23 = auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x10ff3c;
    fdb_commit((fdb_file_handle *)auStack_18628,'\0');
    pfStack_18638 = (fdb_kvs_handle *)0x10ff44;
    fdb_close((fdb_file_handle *)auStack_18628);
    pfStack_18638 = (fdb_kvs_handle *)0x10ff5b;
    pcVar33 = pcVar23;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)auStack_185a0);
    ptr_fhandle = (filemgr *)0x2710;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
    pfStack_18638 = (fdb_kvs_handle *)0x10ff77;
    pcVar33 = (char *)auStack_18628;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18628,(fdb_kvs_handle **)auStack_18620,
                       &fStack_185f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
    pfStack_18638 = (fdb_kvs_handle *)0x10ff97;
    pcVar33 = (char *)auStack_18620;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18620,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
    pcVar23 = auStack_18488;
    pfStack_18638 = (fdb_kvs_handle *)0x10ffb4;
    fdb_get_file_info((fdb_file_handle *)auStack_18628,(fdb_file_info *)pcVar23);
    pfStack_18638 = (fdb_kvs_handle *)0x10ffc3;
    iVar5 = strcmp((char *)auStack_18488._0_8_,"compact_test");
    if (iVar5 != 0) {
      pfStack_18638 = (fdb_kvs_handle *)0x10ffd4;
      compaction_daemon_test();
    }
    ptr_fhandle = (filemgr *)(auStack_18488 + 0x48);
    pfVar14 = (fdb_kvs_handle *)auStack_18610;
    pfVar7 = (fdb_kvs_handle *)0x0;
    _Var28._M_i = doc_00._M_i;
    do {
      pfStack_18638 = (fdb_kvs_handle *)0x10fff8;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar7 & 0xffffffff);
      pfStack_18638 = (fdb_kvs_handle *)0x110000;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_18638 = (fdb_kvs_handle *)0x11001f;
      fdb_doc_create((fdb_doc **)pfVar14,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_18638 = (fdb_kvs_handle *)0x11002e;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_18620,(fdb_doc *)auStack_18610._0_8_);
      doc_00._M_i = auStack_18610._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
        pfStack_18638 = (fdb_kvs_handle *)0x1108a3;
        compaction_daemon_test();
        goto LAB_001108a3;
      }
      pfVar12 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_18610._0_8_ + 0x40))->
                seqtree;
      pcVar23 = *(char **)(*(long *)(&afStack_18140[0].kvs_config.create_if_missing +
                                    (long)pfVar7 * 8) + 0x40);
      pfStack_18638 = (fdb_kvs_handle *)0x11005a;
      iVar5 = bcmp(pfVar12,pcVar23,(size_t)*(void **)(auStack_18610._0_8_ + 0x10));
      _Var28._M_i = doc_00._M_i;
      if (iVar5 != 0) {
        pfStack_18638 = (fdb_kvs_handle *)0x11089e;
        compaction_daemon_test();
        goto LAB_0011089e;
      }
      pfStack_18638 = (fdb_kvs_handle *)0x11006a;
      fdb_doc_free((fdb_doc *)doc_00._M_i);
      pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
    } while (pfVar7 != (fdb_kvs_handle *)0x2710);
    pfStack_18638 = (fdb_kvs_handle *)0x11008e;
    pcVar33 = (char *)auStack_18620;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_18620,(fdb_kvs_handle **)&aStack_185d8,10000
                             );
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
    pfStack_18638 = (fdb_kvs_handle *)0x1100a0;
    fdb_kvs_close((fdb_kvs_handle *)aStack_185d8.super___atomic_base<unsigned_long>._M_i);
    pcVar23 = auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x1100ad;
    fdb_close((fdb_file_handle *)auStack_18628);
    pfStack_18638 = (fdb_kvs_handle *)0x1100b9;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_18638 = (fdb_kvs_handle *)0x1100d0;
    pcVar33 = pcVar23;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
    pfStack_18638 = (fdb_kvs_handle *)0x1100ec;
    pcVar33 = (char *)auStack_18628;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18628,(fdb_kvs_handle **)auStack_18620,
                       &fStack_185f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
    pfStack_18638 = (fdb_kvs_handle *)0x11010c;
    pcVar33 = (char *)auStack_18620;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18620,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
    ptr_fhandle = (filemgr *)(auStack_18488 + 0x48);
    pfVar14 = (fdb_kvs_handle *)auStack_18610;
    pfVar7 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_18638 = (fdb_kvs_handle *)0x110138;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar7 & 0xffffffff);
      pfStack_18638 = (fdb_kvs_handle *)0x110140;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_18638 = (fdb_kvs_handle *)0x11015f;
      fdb_doc_create((fdb_doc **)pfVar14,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_18638 = (fdb_kvs_handle *)0x11016e;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_18620,(fdb_doc *)auStack_18610._0_8_);
      _Var28._M_i = auStack_18610._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
      pfVar12 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_18610._0_8_ + 0x40))->
                seqtree;
      pcVar23 = *(char **)(*(long *)(&afStack_18140[0].kvs_config.create_if_missing +
                                    (long)pfVar7 * 8) + 0x40);
      pfStack_18638 = (fdb_kvs_handle *)0x11019a;
      iVar5 = bcmp(pfVar12,pcVar23,(size_t)*(void **)(auStack_18610._0_8_ + 0x10));
      if (iVar5 != 0) goto LAB_001108a3;
      pfStack_18638 = (fdb_kvs_handle *)0x1101aa;
      fdb_doc_free((fdb_doc *)_Var28._M_i);
      pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
      doc_00._M_i = _Var28._M_i;
    } while (pfVar7 != (fdb_kvs_handle *)0x2710);
    pcVar23 = auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x1101c7;
    fdb_close((fdb_file_handle *)auStack_18628);
    pfStack_18638 = (fdb_kvs_handle *)0x1101d3;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_18638 = (fdb_kvs_handle *)0x1101ea;
    pcVar33 = pcVar23;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
    pfStack_18638 = (fdb_kvs_handle *)0x110206;
    pcVar33 = (char *)auStack_18628;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18628,(fdb_kvs_handle **)auStack_18620,
                       &fStack_185f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
    pfStack_18638 = (fdb_kvs_handle *)0x110226;
    pcVar33 = (char *)auStack_18620;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18620,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
    ptr_fhandle = (filemgr *)(auStack_18488 + 0x48);
    pfVar14 = (fdb_kvs_handle *)auStack_18610;
    pfVar7 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_18638 = (fdb_kvs_handle *)0x110252;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar7 & 0xffffffff);
      pfStack_18638 = (fdb_kvs_handle *)0x11025a;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_18638 = (fdb_kvs_handle *)0x110279;
      fdb_doc_create((fdb_doc **)pfVar14,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_18638 = (fdb_kvs_handle *)0x110288;
      pcVar33 = (char *)auStack_18620;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_18620,(fdb_doc *)auStack_18610._0_8_);
      _Var28._M_i = auStack_18610._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108be;
      pfVar12 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_18610._0_8_ + 0x40))->
                seqtree;
      pcVar23 = *(char **)(*(long *)(&afStack_18140[0].kvs_config.create_if_missing +
                                    (long)pfVar7 * 8) + 0x40);
      pfStack_18638 = (fdb_kvs_handle *)0x1102b4;
      iVar5 = bcmp(pfVar12,pcVar23,(size_t)*(void **)(auStack_18610._0_8_ + 0x10));
      if (iVar5 != 0) goto LAB_001108b3;
      pfStack_18638 = (fdb_kvs_handle *)0x1102c4;
      fdb_doc_free((fdb_doc *)_Var28._M_i);
      pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
      doc_00._M_i = _Var28._M_i;
    } while (pfVar7 != (fdb_kvs_handle *)0x2710);
    pfStack_18638 = (fdb_kvs_handle *)0x1102de;
    fdb_close((fdb_file_handle *)auStack_18628);
    pcVar33 = auStack_18600;
    pfStack_18638 = (fdb_kvs_handle *)0x1102f7;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_less",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
    pfStack_18638 = (fdb_kvs_handle *)0x110313;
    pcVar33 = (char *)auStack_18600._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18600._0_8_,
                       (fdb_kvs_handle **)&aStack_185c0.seqtree,&fStack_185f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110904;
    uStack_18572 = uStack_18572 & 0xff;
    pcVar33 = auStack_18610 + 8;
    pfStack_18638 = (fdb_kvs_handle *)0x110338;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110909;
    pfStack_18638 = (fdb_kvs_handle *)0x110354;
    pcVar33 = (char *)auStack_18610._8_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18610._8_8_,(fdb_kvs_handle **)&_Stack_185c8,
                       &fStack_185f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
    uStack_18572 = uStack_18572 & 0xff00;
    pcVar33 = auStack_18618;
    pfStack_18638 = (fdb_kvs_handle *)0x110379;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110913;
    pfStack_18638 = (fdb_kvs_handle *)0x110395;
    pcVar33 = (char *)auStack_18618;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18618,(fdb_kvs_handle **)&aStack_185d0.seqtree,
                       &fStack_185f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110918;
    uStack_18572 = 0x1e01;
    pcVar33 = auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x1103bc;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
    pfStack_18638 = (fdb_kvs_handle *)0x1103d8;
    pcVar33 = (char *)auStack_18628;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18628,(fdb_kvs_handle **)auStack_18620,
                       &fStack_185f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110922;
    pfStack_18638 = (fdb_kvs_handle *)0x1103f8;
    pcVar33 = (char *)auStack_18620;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18620,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110927;
    _Var28._M_i = 0;
    pfStack_18638 = (fdb_kvs_handle *)0x110416;
    printf("wait for %d seconds..\n");
    pcVar23 = auStack_184a8;
    pfStack_18638 = (fdb_kvs_handle *)0x110428;
    gettimeofday((timeval *)pcVar23,(__timezone_ptr_t)0x0);
    tVar37.tv_usec = auStack_184a8._8_8_;
    tVar37.tv_sec = auStack_184a8._0_8_;
    pfVar7 = (fdb_kvs_handle *)auStack_185b0;
    while( true ) {
      pfStack_18638 = (fdb_kvs_handle *)0x110449;
      fdb_set((fdb_kvs_handle *)auStack_18620,
              *(fdb_doc **)(&afStack_18140[0].kvs_config.create_if_missing + _Var28._M_i * 8));
      pfStack_18638 = (fdb_kvs_handle *)0x110455;
      fdb_commit((fdb_file_handle *)auStack_18628,'\0');
      if ((ushort)((ushort)((short)_Var28._M_i * 0x5c29) >> 2 | (short)_Var28._M_i * 0x4000) < 0x290
         ) {
        pfStack_18638 = (fdb_kvs_handle *)0x11047c;
        fdb_set((fdb_kvs_handle *)aStack_185c0.seqtree,
                *(fdb_doc **)(&afStack_18140[0].kvs_config.create_if_missing + _Var28._M_i * 8));
        pfStack_18638 = (fdb_kvs_handle *)0x110488;
        fdb_commit((fdb_file_handle *)auStack_18600._0_8_,'\0');
      }
      pfStack_18638 = (fdb_kvs_handle *)0x11049a;
      fdb_set((fdb_kvs_handle *)_Stack_185c8._M_i,
              *(fdb_doc **)(&afStack_18140[0].kvs_config.create_if_missing + _Var28._M_i * 8));
      pfStack_18638 = (fdb_kvs_handle *)0x1104a6;
      fdb_commit((fdb_file_handle *)auStack_18610._8_8_,'\0');
      pfStack_18638 = (fdb_kvs_handle *)0x1104b8;
      fdb_set((fdb_kvs_handle *)aStack_185d0.seqtree,
              *(fdb_doc **)(&afStack_18140[0].kvs_config.create_if_missing + _Var28._M_i * 8));
      pfStack_18638 = (fdb_kvs_handle *)0x1104c4;
      fdb_commit((fdb_file_handle *)auStack_18618,'\0');
      pfStack_18638 = (fdb_kvs_handle *)0x1104ce;
      gettimeofday((timeval *)pfVar7,(__timezone_ptr_t)0x0);
      pfStack_18638 = (fdb_kvs_handle *)0x1104e9;
      tVar36 = _utime_gap(tVar37,(timeval)auStack_185b0);
      if ((ulong)auStack_18600._8_8_ <= (fdb_kvs_handle *)tVar36.tv_sec) break;
      _Var28._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var28._M_i)->kvs_config).field_0x1;
      if ((undefined1 *)_Var28._M_i == (undefined1 *)0x2710) {
        _Var28._M_i = 0;
      }
    }
    pfStack_18638 = (fdb_kvs_handle *)0x110517;
    pcVar33 = (char *)auStack_18628;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_18628,0x3c);
    ptr_fhandle = (filemgr *)auStack_184a8._0_8_;
    pfVar14 = (fdb_kvs_handle *)auStack_184a8._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
    pfStack_18638 = (fdb_kvs_handle *)0x11052e;
    pcVar33 = (char *)auStack_18628;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_18628,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110931;
    pfStack_18638 = (fdb_kvs_handle *)0x110542;
    pcVar33 = (char *)auStack_18610._8_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_18610._8_8_,(char *)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110936;
    pfStack_18638 = (fdb_kvs_handle *)0x11055b;
    pcVar33 = (char *)auStack_18618;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_18618,"compact_test_manual_compacted");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
    uStack_18572 = uStack_18572 & 0xff00;
    pcVar33 = auStack_185b8;
    pfStack_18638 = (fdb_kvs_handle *)0x110580;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual_compacted",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110940;
    pfStack_18638 = (fdb_kvs_handle *)0x11059c;
    pcVar33 = (char *)auStack_18618;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_18618,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
    pfStack_18638 = (fdb_kvs_handle *)0x1105af;
    fVar4 = fdb_close((fdb_file_handle *)auStack_185b8);
    pcVar33 = (char *)auStack_185b8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
    pfStack_18638 = (fdb_kvs_handle *)0x1105cb;
    pcVar33 = (char *)auStack_18618;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_18618,'\x01',10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
    pfStack_18638 = (fdb_kvs_handle *)0x1105e7;
    pcVar33 = (char *)auStack_18618;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_18618,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110954;
    pfStack_18638 = (fdb_kvs_handle *)0x1105f9;
    pcVar33 = (char *)auStack_18618;
    fVar4 = fdb_close((fdb_file_handle *)auStack_18618);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110959;
    uStack_18572 = CONCAT11(uStack_18572._1_1_,1);
    pcVar33 = auStack_18618;
    pfStack_18638 = (fdb_kvs_handle *)0x11061e;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual_compacted",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
    pfStack_18638 = (fdb_kvs_handle *)0x110634;
    pcVar33 = (char *)auStack_18610._8_8_;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_18610._8_8_,'\0',0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110963;
    pfStack_18638 = (fdb_kvs_handle *)0x110646;
    pcVar33 = (char *)auStack_18610._8_8_;
    fVar4 = fdb_close((fdb_file_handle *)auStack_18610._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110968;
    uStack_18572 = uStack_18572 & 0xff00;
    pcVar33 = auStack_18610 + 8;
    pfStack_18638 = (fdb_kvs_handle *)0x11066b;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
    pcVar23 = "compact_test_non.manual";
    pfStack_18638 = (fdb_kvs_handle *)0x110687;
    fdb_compact((fdb_file_handle *)auStack_18610._8_8_,"compact_test_non.manual");
    ptr_fhandle = (filemgr *)auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x110694;
    fdb_close((fdb_file_handle *)auStack_18628);
    pfStack_18638 = (fdb_kvs_handle *)0x11069e;
    fdb_close((fdb_file_handle *)auStack_18600._0_8_);
    pfStack_18638 = (fdb_kvs_handle *)0x1106a8;
    fdb_close((fdb_file_handle *)auStack_18618);
    uStack_18572 = CONCAT11(uStack_18572._1_1_,1);
    pfStack_18638 = (fdb_kvs_handle *)0x1106bf;
    pcVar33 = (char *)ptr_fhandle;
    fVar4 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
    pcVar33 = "compact_test_non.manual";
    pfStack_18638 = (fdb_kvs_handle *)0x1106dc;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
    uStack_18572 = uStack_18572 & 0xff00;
    pcVar33 = auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x110702;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual_compacted",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
    pcVar33 = "compact_test_manual_compacted";
    pfStack_18638 = (fdb_kvs_handle *)0x11071f;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
    uStack_18572 = CONCAT11(uStack_18572._1_1_,1);
    pcVar33 = "compact_test_manual_compacted";
    pfStack_18638 = (fdb_kvs_handle *)0x110740;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110986;
    uStack_18572 = uStack_18572 & 0xff00;
    pcVar33 = "compact_test_non.manual";
    pfStack_18638 = (fdb_kvs_handle *)0x110760;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
    pfStack_18638 = (fdb_kvs_handle *)0x110773;
    fdb_close((fdb_file_handle *)auStack_18610._8_8_);
    pfStack_18638 = (fdb_kvs_handle *)0x110778;
    fVar4 = fdb_shutdown();
    pcVar33 = (char *)auStack_18610._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110990;
    pcVar33 = "compact_test_non.manual";
    pfStack_18638 = (fdb_kvs_handle *)0x110794;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110995;
    fStack_1857c = 2;
    pcVar33 = auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x1107bc;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
    pcVar33 = auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x1107de;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
    pcVar33 = auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x110800;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
    pcVar33 = auStack_18628;
    pfStack_18638 = (fdb_kvs_handle *)0x110822;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non.manual",
                     (fdb_config *)auStack_185a0);
    if (fVar4 == FDB_RESULT_NO_SUCH_FILE) {
      lVar17 = 0;
      do {
        pfStack_18638 = (fdb_kvs_handle *)0x11083a;
        fdb_doc_free(*(fdb_doc **)(&afStack_18140[0].kvs_config.create_if_missing + lVar17 * 8));
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10000);
      pfStack_18638 = (fdb_kvs_handle *)0x11084b;
      fdb_shutdown();
      pfStack_18638 = (fdb_kvs_handle *)0x110850;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_18638 = (fdb_kvs_handle *)0x110881;
      iVar5 = fprintf(_stderr,pcVar23,"compaction daemon test");
      return iVar5;
    }
  }
  else {
LAB_001108c3:
    pfStack_18638 = (fdb_kvs_handle *)0x1108c8;
    compaction_daemon_test();
LAB_001108c8:
    pfStack_18638 = (fdb_kvs_handle *)0x1108cd;
    compaction_daemon_test();
LAB_001108cd:
    pfStack_18638 = (fdb_kvs_handle *)0x1108d2;
    compaction_daemon_test();
LAB_001108d2:
    pfStack_18638 = (fdb_kvs_handle *)0x1108d7;
    compaction_daemon_test();
LAB_001108d7:
    pfStack_18638 = (fdb_kvs_handle *)0x1108dc;
    compaction_daemon_test();
LAB_001108dc:
    pfStack_18638 = (fdb_kvs_handle *)0x1108e1;
    compaction_daemon_test();
LAB_001108e1:
    pfStack_18638 = (fdb_kvs_handle *)0x1108e6;
    compaction_daemon_test();
LAB_001108e6:
    pfStack_18638 = (fdb_kvs_handle *)0x1108eb;
    compaction_daemon_test();
    _Var28._M_i = doc_00._M_i;
LAB_001108eb:
    pfStack_18638 = (fdb_kvs_handle *)0x1108f0;
    compaction_daemon_test();
LAB_001108f0:
    pfStack_18638 = (fdb_kvs_handle *)0x1108f5;
    compaction_daemon_test();
LAB_001108f5:
    pfStack_18638 = (fdb_kvs_handle *)0x1108fa;
    compaction_daemon_test();
LAB_001108fa:
    pfStack_18638 = (fdb_kvs_handle *)0x1108ff;
    compaction_daemon_test();
LAB_001108ff:
    pfStack_18638 = (fdb_kvs_handle *)0x110904;
    compaction_daemon_test();
LAB_00110904:
    pfStack_18638 = (fdb_kvs_handle *)0x110909;
    compaction_daemon_test();
LAB_00110909:
    pfStack_18638 = (fdb_kvs_handle *)0x11090e;
    compaction_daemon_test();
LAB_0011090e:
    pfStack_18638 = (fdb_kvs_handle *)0x110913;
    compaction_daemon_test();
LAB_00110913:
    pfStack_18638 = (fdb_kvs_handle *)0x110918;
    compaction_daemon_test();
LAB_00110918:
    pfStack_18638 = (fdb_kvs_handle *)0x11091d;
    compaction_daemon_test();
LAB_0011091d:
    pfStack_18638 = (fdb_kvs_handle *)0x110922;
    compaction_daemon_test();
LAB_00110922:
    pfStack_18638 = (fdb_kvs_handle *)0x110927;
    compaction_daemon_test();
LAB_00110927:
    pfStack_18638 = (fdb_kvs_handle *)0x11092c;
    compaction_daemon_test();
LAB_0011092c:
    pfStack_18638 = (fdb_kvs_handle *)0x110931;
    compaction_daemon_test();
LAB_00110931:
    pfStack_18638 = (fdb_kvs_handle *)0x110936;
    compaction_daemon_test();
LAB_00110936:
    pfStack_18638 = (fdb_kvs_handle *)0x11093b;
    compaction_daemon_test();
LAB_0011093b:
    pfStack_18638 = (fdb_kvs_handle *)0x110940;
    compaction_daemon_test();
LAB_00110940:
    pfStack_18638 = (fdb_kvs_handle *)0x110945;
    compaction_daemon_test();
LAB_00110945:
    pfStack_18638 = (fdb_kvs_handle *)0x11094a;
    compaction_daemon_test();
LAB_0011094a:
    pfStack_18638 = (fdb_kvs_handle *)0x11094f;
    compaction_daemon_test();
LAB_0011094f:
    pfStack_18638 = (fdb_kvs_handle *)0x110954;
    compaction_daemon_test();
LAB_00110954:
    pfStack_18638 = (fdb_kvs_handle *)0x110959;
    compaction_daemon_test();
LAB_00110959:
    pfStack_18638 = (fdb_kvs_handle *)0x11095e;
    compaction_daemon_test();
LAB_0011095e:
    pfStack_18638 = (fdb_kvs_handle *)0x110963;
    compaction_daemon_test();
LAB_00110963:
    pfStack_18638 = (fdb_kvs_handle *)0x110968;
    compaction_daemon_test();
LAB_00110968:
    pfStack_18638 = (fdb_kvs_handle *)0x11096d;
    compaction_daemon_test();
LAB_0011096d:
    pfStack_18638 = (fdb_kvs_handle *)0x110972;
    compaction_daemon_test();
LAB_00110972:
    pfStack_18638 = (fdb_kvs_handle *)0x110977;
    compaction_daemon_test();
LAB_00110977:
    pfStack_18638 = (fdb_kvs_handle *)0x11097c;
    compaction_daemon_test();
LAB_0011097c:
    pfStack_18638 = (fdb_kvs_handle *)0x110981;
    compaction_daemon_test();
LAB_00110981:
    pfStack_18638 = (fdb_kvs_handle *)0x110986;
    compaction_daemon_test();
LAB_00110986:
    pfStack_18638 = (fdb_kvs_handle *)0x11098b;
    compaction_daemon_test();
LAB_0011098b:
    pfStack_18638 = (fdb_kvs_handle *)0x110990;
    compaction_daemon_test();
LAB_00110990:
    pfStack_18638 = (fdb_kvs_handle *)0x110995;
    compaction_daemon_test();
LAB_00110995:
    pfStack_18638 = (fdb_kvs_handle *)0x11099a;
    compaction_daemon_test();
LAB_0011099a:
    pfStack_18638 = (fdb_kvs_handle *)0x11099f;
    compaction_daemon_test();
LAB_0011099f:
    pfStack_18638 = (fdb_kvs_handle *)0x1109a4;
    compaction_daemon_test();
LAB_001109a4:
    pfStack_18638 = (fdb_kvs_handle *)0x1109a9;
    compaction_daemon_test();
  }
  pfStack_18638 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_187d0 = (fdb_kvs_handle *)0x1109ce;
  pfStack_18660 = (filemgr *)pcVar23;
  pfStack_18658 = pfVar7;
  pfStack_18650 = (fdb_kvs_handle *)_Var28._M_i;
  pfStack_18648 = ptr_fhandle;
  pfStack_18640 = pfVar14;
  pfStack_18638 = pfVar12;
  gettimeofday(&tStack_18780,(__timezone_ptr_t)0x0);
  pfStack_187d0 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_187d0 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_187d0 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_1872a = 1;
  uStack_18720._0_2_ = 1;
  uStack_18720._2_2_ = 0;
  uStack_18720._4_4_ = 0;
  pfStack_187d0 = (fdb_kvs_handle *)0x110a0d;
  fVar4 = fdb_open(&pfStack_187c0,"compact_test",(fdb_config *)(auStack_18770 + 0x18));
  pfVar29 = (fdb_config *)(auStack_18770 + 0x18);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar29 = (fdb_config *)auStack_18770;
    pfStack_187d0 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_187d0 = (fdb_kvs_handle *)0x110a34;
    fVar4 = fdb_kvs_open_default(pfStack_187c0,&pfStack_187b8,(fdb_kvs_config *)pfVar29);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_187d0 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_18790,(__timezone_ptr_t)0x0);
    pfStack_187d0 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)pcVar33 & 0xffffffff);
    tVar36.tv_usec = tStack_18790.tv_usec;
    tVar36.tv_sec = tStack_18790.tv_sec;
    _Var28._M_i = (long)&atStack_187b0[1].tv_sec + 1;
    pfVar12 = (fdb_kvs_handle *)0x0;
    do {
      iVar5 = (int)pfVar12;
      pfStack_187d0 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var28._M_i,"%d",pfVar12);
      pfVar7 = pfStack_187b8;
      pfStack_187d0 = (fdb_kvs_handle *)0x110a89;
      sVar6 = strlen((char *)_Var28._M_i);
      pfStack_187d0 = (fdb_kvs_handle *)0x110aa4;
      fVar4 = fdb_set_kv(pfVar7,(void *)_Var28._M_i,sVar6,"value",5);
      pfVar29 = (fdb_config *)tStack_18790.tv_sec;
      pfVar14 = (fdb_kvs_handle *)tStack_18790.tv_usec;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_187d0 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_187d0 = (fdb_kvs_handle *)0x110ab8;
      fVar4 = fdb_commit(pfStack_187c0,'\0');
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_187d0 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_187d0 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_187b0,(__timezone_ptr_t)0x0);
      pfStack_187d0 = (fdb_kvs_handle *)0x110ae1;
      tVar37 = _utime_gap(tVar36,atStack_187b0[0]);
    } while (((filemgr *)tVar37.tv_sec < pcVar33) &&
            (pfVar12 = (fdb_kvs_handle *)(ulong)(iVar5 + 1), iVar5 != 99999));
    pfStack_187d0 = (fdb_kvs_handle *)0x110b01;
    fVar4 = fdb_close(pfStack_187c0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_187d0 = (fdb_kvs_handle *)0x110b0a;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_187d0 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_187d0 = (fdb_kvs_handle *)0x110b44;
      iVar5 = fprintf(_stderr,pcVar23,"auto compaction with concurrent insert test");
      return iVar5;
    }
  }
  else {
LAB_00110b60:
    pfStack_187d0 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_187d0 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_187d0 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_187d0 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_187f8 = (filemgr *)pcVar33;
  pfStack_187f0 = pfVar7;
  pfStack_187e8 = (fdb_kvs_handle *)_Var28._M_i;
  pfStack_187e0 = pfVar29;
  pfStack_187d8 = pfVar14;
  pfStack_187d0 = pfVar12;
  gettimeofday(&tStack_18b00,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_18b70._32_8_ = (btree *)0x0;
  auStack_18b70._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_188f0.wal_threshold = 0x1000;
  fStack_188f0.compaction_mode = '\x01';
  fStack_188f0.compaction_threshold = '\n';
  fStack_188f0.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14d0c5;
  pfVar12 = (fdb_kvs_handle *)&pfStack_18b90;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar4 = fdb_open_custom_cmp((fdb_file_handle **)pfVar12,"compact_test",&fStack_188f0,1,
                              (char **)(auStack_18b70 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_18b70 + 0x18),(void **)0x0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_18b70._16_8_ = afStack_18af0[0].doc_count;
    auStack_18b70._0_8_ = afStack_18af0[0].filename;
    auStack_18b70._8_8_ = afStack_18af0[0].new_filename;
    info = (fdb_file_info *)auStack_18b88;
    pfVar12 = pfStack_18b90;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18b90,(fdb_kvs_handle **)info,
                       (fdb_kvs_config *)auStack_18b70);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info = (fdb_file_info *)auStack_18b78;
    kvs_config_00 = (fdb_file_info *)auStack_18b70;
    pfVar12 = pfStack_18b90;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18b90,(fdb_kvs_handle **)info,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar16 = 0;
    do {
      sprintf((char *)afStack_18af0,"key%06d",uVar16);
      sprintf((char *)afStack_189f0,"body%06d",uVar16);
      pfVar12 = (fdb_kvs_handle *)auStack_18b88._0_8_;
      sVar6 = strlen((char *)afStack_18af0);
      sVar8 = strlen((char *)afStack_189f0);
      kvs_config_00 = afStack_189f0;
      info = afStack_18af0;
      fVar4 = fdb_set_kv(pfVar12,afStack_18af0,sVar6,afStack_189f0,sVar8);
      handle = auStack_18b78;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar6 = strlen((char *)afStack_18af0);
      sVar8 = strlen((char *)afStack_189f0);
      kvs_config_00 = afStack_189f0;
      info = afStack_18af0;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_18af0,sVar6,afStack_189f0,sVar8);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar12 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar21 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar21;
    } while (uVar21 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_18b70;
    auStack_18b70._8_8_ = _compact_test_keycmp;
    info = (fdb_file_info *)(auStack_18b88 + 8);
    pfVar12 = pfStack_18b90;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18b90,(fdb_kvs_handle **)info,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info = afStack_18af0;
    sprintf((char *)info,"key%06d",0);
    kvs_config_00 = afStack_189f0;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar6 = strlen((char *)info);
    sVar8 = strlen((char *)kvs_config_00);
    fVar4 = fdb_set_kv((fdb_kvs_handle *)auStack_18b88._8_8_,info,sVar6,kvs_config_00,sVar8);
    pfVar12 = (fdb_kvs_handle *)auStack_18b88._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info = (fdb_file_info *)0x0;
    pfVar12 = pfStack_18b90;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18b90,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar16 = 0;
    uVar30 = 0;
    do {
      sprintf((char *)afStack_18af0,"key%06d",uVar30);
      sprintf((char *)afStack_189f0,"body%06d",uVar30);
      pfVar12 = (fdb_kvs_handle *)auStack_18b88._0_8_;
      sVar6 = strlen((char *)afStack_18af0);
      sVar8 = strlen((char *)afStack_189f0);
      kvs_config_00 = afStack_189f0;
      info = afStack_18af0;
      fVar4 = fdb_set_kv(pfVar12,afStack_18af0,sVar6,afStack_189f0,sVar8);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info = (fdb_file_info *)(auStack_18b70 + 0x28);
      pfVar12 = pfStack_18b90;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18b90,info);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar16 < uStack_18b20) {
        uVar16 = uStack_18b20;
      }
      uVar21 = (int)uVar30 + 1;
      uVar30 = (ulong)uVar21;
    } while (uVar21 != 10000);
    info = (fdb_file_info *)0x0;
    pfVar12 = pfStack_18b90;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18b90,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info = (fdb_file_info *)(auStack_18b70 + 0x28);
    pfVar12 = pfStack_18b90;
    fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18b90,info);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar16 < uStack_18b20) {
      uVar16 = uStack_18b20;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar16);
    do {
      sleep(1);
      info = (fdb_file_info *)(auStack_18b70 + 0x28);
      pfVar12 = pfStack_18b90;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18b90,
                                (fdb_file_info *)(auStack_18b70 + 0x28));
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar16 <= uStack_18b20);
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18b90);
    pfVar12 = pfStack_18b90;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fVar4 = fdb_shutdown();
      pfVar12 = pfStack_18b90;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        iVar5 = fprintf(_stderr,pcVar23,"auto compaction with custom comparison function");
        return iVar5;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info != kvs_config_00) {
    __n = kvs_config_00;
    if (info < kvs_config_00) {
      __n = info;
    }
    iVar5 = memcmp(pfVar12,__s2,(size_t)__n);
    if (iVar5 == 0) {
      iVar5 = (int)info - (int)kvs_config_00;
    }
    return iVar5;
  }
  iVar5 = memcmp(pfVar12,__s2,(size_t)info);
  return iVar5;
}

Assistant:

static fdb_compact_decision compaction_cb(fdb_file_handle *fhandle,
                            fdb_compaction_status status, const char *kv_name,
                            fdb_doc *doc, uint64_t old_offset,
                            uint64_t new_offset,
                            void *ctx)
{
    TEST_INIT();
    fdb_doc *rdoc;
    fdb_status s;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    struct cb_args *args = (struct cb_args *)ctx;

    (void) doc;
    (void) new_offset;

    if (status == FDB_CS_BEGIN) {
        args->begin = true;
    } else if (status == FDB_CS_END) {
        args->end = true;
    } else if (status == FDB_CS_FLUSH_WAL) {
        args->wal_flush = true;
    } else if (status == FDB_CS_MOVE_DOC) {
        if (doc->deleted) {
            ret = FDB_CS_DROP_DOC;
        }

        args->n_moved_docs++;
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->offset = old_offset;
        s = fdb_get_byoffset(args->handle, rdoc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);

        if (fhandle->root->config.multi_kv_instances) {
            TEST_CMP(kv_name, "db", 2);
        } else {
            TEST_CMP(kv_name, "default", 7);
        }
    } else { // FDB_CS_BATCH_MOVE
        args->n_batch_move++;
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->offset = old_offset;
        s = fdb_get_byoffset(args->handle, rdoc);
        TEST_CHK (s == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }
    return ret;
}